

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Decode.cpp
# Opt level: O1

error<idx2::idx2_err_code> idx2::Decode(idx2_file *Idx2,params *P,buffer *OutBuf)

{
  brick_pool *Bp;
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  out_mode oVar3;
  cstr pcVar4;
  u64 uVar5;
  unsigned_long uVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong uVar9;
  hash_table<unsigned_long,_idx2::brick_volume> *phVar10;
  i64 iVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  byte *pbVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  allocator *paVar20;
  dtype dVar21;
  iterator iVar22;
  byte bVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  undefined8 extraout_RAX;
  u64 uVar31;
  undefined8 uVar32;
  code *pcVar33;
  char cVar34;
  char cVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  mmap_volume *Vol;
  long lVar39;
  undefined1 (*pauVar40) [32];
  brick_volume *pbVar41;
  brick_volume *Vol_00;
  short *Key;
  ulong *puVar42;
  ulong *puVar43;
  grid *Grid2;
  byte **Key_00;
  char *pcVar44;
  byte bVar45;
  undefined1 uVar46;
  dtype dVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  ulong uVar51;
  long lVar52;
  size_t __n;
  uint uVar53;
  params *ppVar54;
  iterator *piVar55;
  int iVar56;
  idx2 *piVar57;
  ulong *puVar58;
  ulong *puVar59;
  byte *pbVar60;
  int iVar61;
  byte *pbVar62;
  idx2_file *piVar63;
  ulong *puVar64;
  brick_volume *Val;
  ulong uVar65;
  long lVar66;
  uint uVar67;
  byte bVar68;
  uint uVar69;
  ulong uVar70;
  iterator *piVar71;
  undefined7 uVar72;
  int iVar73;
  long lVar74;
  ushort uVar75;
  uint uVar76;
  undefined8 uVar77;
  idx2 *this;
  hash_table<short,_idx2::bitstream> *phVar78;
  int iVar79;
  uint uVar80;
  bitstream *pbVar81;
  long *in_FS_OFFSET;
  bool bVar82;
  undefined1 auVar83 [16];
  error<idx2::mmap_err_code> eVar84;
  extent eVar85;
  error<idx2::idx2_err_code> eVar86;
  v3i Brick3;
  v3i Brick3_00;
  i8 N;
  i16 BpKey;
  u64 BrickKey;
  extent PGrid;
  u64 PKey;
  grid SbGridNonExt;
  extent ExtentInChunks;
  extent ExtentInBricks;
  extent Skip_1;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Decode_cpp:362:3)>
  __ScopeGuard__362;
  stream_cache Streams;
  grid OutGrid;
  extent VolExtentInChunks;
  extent VolExtentInBricks;
  timer DecodeTimer;
  chunk_traverse Second_1;
  mmap_volume OutVol;
  iterator BrickIt_1;
  extent Skip;
  iterator BrickIt;
  decode_data D;
  file_traverse Second;
  file_traverse First;
  file_traverse FileStack [64];
  i8 local_37bd;
  uint local_37bc;
  idx2_file *local_37b8;
  ulong local_37b0;
  undefined4 local_37a8;
  undefined1 local_37a4 [4];
  ulong local_37a0;
  uint local_3794;
  brick_volume *local_3790;
  uint local_3784;
  undefined8 local_3780;
  undefined8 local_3778;
  uint local_376c;
  uint local_3768;
  int local_3764;
  params *local_3760;
  long local_3758;
  ulong local_3750;
  ulong local_3748;
  ulong local_3740;
  uint local_3738;
  int local_3734;
  uint local_3730;
  uint local_372c;
  uint local_3728;
  uint local_3724;
  undefined8 local_3720;
  byte *local_3718;
  ulong local_3710;
  ulong local_3708;
  ulong local_3700;
  long local_36f8;
  int local_36ec;
  int local_36e8;
  uint local_36e4;
  uint local_36e0;
  int local_36dc;
  int local_36d8;
  int local_36d4;
  long local_36d0;
  long local_36c8;
  ulong local_36c0;
  iterator *local_36b8;
  ulong local_36b0;
  byte *local_36a8;
  long local_36a0;
  v3<int> *local_3698;
  ulong local_3690;
  iterator *local_3688;
  undefined1 (*local_3680) [16];
  long local_3678;
  undefined1 local_3670 [8];
  iterator local_3668;
  int local_3644;
  int local_3640;
  uint local_363c;
  int local_3638;
  int local_3634;
  int local_3630;
  uint local_362c;
  uint local_3628;
  uint local_3624;
  uint local_3620;
  uint local_361c;
  undefined1 local_3618 [24];
  bool local_3600;
  undefined1 local_35f8 [8];
  anon_union_16_2_4399d23d_for_expected<const_idx2::chunk_exp_cache_*,_idx2::idx2_err_code>_3
  aStack_35f0;
  bool local_35e0;
  stack_array<idx2::v3<int>,_16> *local_35d8;
  stack_array<idx2::v3<int>,_16> *local_35d0;
  stack_array<idx2::v3<int>,_16> *local_35c8;
  ulong local_35c0;
  long local_35b8;
  ulong local_35b0;
  ulong local_35a8;
  ulong local_35a0;
  ulong local_3598;
  undefined4 *local_3590;
  undefined8 *local_3588;
  v3i *local_3580;
  brick_volume *local_3578;
  hash_table<short,_idx2::bitstream> *local_3570;
  ulong local_3568;
  ulong local_3560;
  ulong local_3558;
  ulong local_3550;
  ulong local_3548;
  double local_3540;
  extent local_3538;
  extent local_3528;
  brick_volume local_3518;
  byte *local_34d8;
  i64 iStack_34d0;
  allocator *local_34c8;
  ulong local_34c0;
  dtype local_34b8;
  stack_array<idx2::array<idx2::v3<int>_>,_16> *local_34a8;
  stack_array<idx2::v3<int>,_16> *local_34a0;
  long local_3498;
  ulong local_3490;
  v3<int> *local_3488;
  long local_3480;
  transform_info *local_3478;
  array<idx2::subband> *local_3470;
  hash_table<short,_idx2::bitstream> *local_3468;
  v3<int> *local_3460;
  long local_3458;
  idx2 *local_3450;
  hash_table<short,_idx2::bitstream> *local_3448;
  idx2 *local_3440;
  array<idx2::v3<int>_> *local_3438;
  ulong local_3430;
  long local_3428;
  iterator *local_3420;
  ulong local_3418;
  long local_3410;
  ulong local_3408;
  ulong local_3400;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Decode_cpp:362:3)>
  local_33f8;
  hash_table<short,_idx2::bitstream> local_33e8;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Decode_cpp:334:3)>
  local_33b8;
  grid local_33a0;
  extent local_3388;
  extent local_3378;
  timespec local_3368;
  hash_table<unsigned_long,_idx2::brick_volume> local_3358;
  ulong uStack_3328;
  ulong uStack_3320;
  undefined1 local_3158 [72];
  allocator *local_3110;
  iterator local_3108;
  iterator local_30e8;
  undefined8 local_30c8;
  brick_volume *pbStack_30c0;
  hash_table<unsigned_long,_idx2::brick_volume> *phStack_30b8;
  ulong uStack_30b0;
  iterator local_2ee8;
  undefined1 local_2ec8 [56];
  brick_pool bStack_2e90;
  thread_pool local_2e28;
  __native_type local_2d28;
  __native_type _Stack_2d00;
  __native_type _Stack_2cd8;
  condition_variable local_2cb0 [48];
  i64 local_2c80;
  __atomic_base<unsigned_long> _Stack_2c78;
  __atomic_base<unsigned_long> _Stack_2c70;
  __atomic_base<unsigned_long> _Stack_2c68;
  __atomic_base<unsigned_long> local_2c60;
  atomic<unsigned_long> aStack_2c58;
  __atomic_base<long> _Stack_2c50;
  __atomic_base<long> _Stack_2c48;
  undefined4 auStack_2c40 [2];
  iterator local_2c38;
  undefined8 uStack_2c18;
  ulong uStack_2c10;
  ulong auStack_2c08 [2];
  iterator iStack_2bf8;
  ulong auStack_2bd8 [498];
  undefined8 uStack_1c48;
  undefined4 auStack_1c40 [2];
  metadata local_1c38 [28];
  unsigned_long local_c38 [2];
  int aiStack_c28 [2];
  undefined1 auStack_c20 [8];
  int aiStack_c18 [2];
  ulong auStack_c10 [380];
  
  clock_gettime(1,&local_3368);
  local_37b8 = Idx2;
  local_3760 = P;
  GetGrid(&local_33a0,Idx2,&P->DecodeExtent);
  if (Mallocator()::Instance == '\0') {
    Decode();
  }
  local_3158._0_8_ = (byte *)0x0;
  local_3158._8_8_ = 0;
  local_3158._16_8_ = &Mallocator()::Instance;
  local_3158._24_8_ = 0;
  local_3158[0x20] = __Invalid__;
  if (Mallocator()::Instance == '\0') {
    Decode();
  }
  local_3158._56_16_ = SUB6416(ZEXT864(0),0) << 0x40;
  local_3110 = (allocator *)&Mallocator()::Instance;
  if (Mallocator()::Instance == '\0') {
    Decode();
  }
  local_34d8 = (byte *)0x0;
  iStack_34d0 = 0;
  local_34c8 = (allocator *)&Mallocator()::Instance;
  local_34c0 = 0;
  local_34b8 = __Invalid__;
  local_33b8.Func.P = local_3760;
  Vol = (mmap_volume *)local_3158;
  local_33b8.Dismissed = false;
  local_33b8.Func.OutVol = Vol;
  if (local_3760->OutMode == RegularGridMem) {
    local_34c8 = OutBuf->Alloc;
    local_34d8 = OutBuf->Data;
    iStack_34d0 = OutBuf->Bytes;
    local_34c0 = local_33a0.super_extent.Dims & 0x7fffffffffffffff;
    local_34b8 = local_37b8->DType;
  }
  else if (local_3760->OutMode == RegularGridFile) {
    local_1c38[0].Name._0_8_ = *(undefined8 *)local_37b8->Name;
    local_1c38[0].Name._8_8_ = *(undefined8 *)(local_37b8->Name + 8);
    local_1c38[0].Name._40_8_ = *(undefined8 *)(local_37b8->Name + 0x28);
    local_1c38[0].Name._48_8_ = *(undefined8 *)(local_37b8->Name + 0x30);
    local_1c38[0].Name._56_8_ = *(undefined8 *)(local_37b8->Name + 0x38);
    local_1c38[0].Name._16_4_ = (undefined4)*(undefined8 *)(local_37b8->Name + 0x10);
    local_1c38[0].Name._20_4_ =
         (undefined4)((ulong)*(undefined8 *)(local_37b8->Name + 0x10) >> 0x20);
    local_1c38[0].Name._24_4_ = (undefined4)*(undefined8 *)(local_37b8->Name + 0x18);
    local_1c38[0].Name._28_4_ =
         (undefined4)((ulong)*(undefined8 *)(local_37b8->Name + 0x18) >> 0x20);
    local_1c38[0].Name._32_4_ = (undefined4)*(undefined8 *)(local_37b8->Name + 0x20);
    local_1c38[0].Name._36_4_ =
         (undefined4)((ulong)*(undefined8 *)(local_37b8->Name + 0x20) >> 0x20);
    local_1c38[0].Field._0_8_ = *(undefined8 *)local_37b8->Field;
    local_1c38[0].Field._8_8_ = *(undefined8 *)(local_37b8->Field + 8);
    local_1c38[0].Field._16_8_ = *(undefined8 *)(local_37b8->Field + 0x10);
    local_1c38[0].Field._24_8_ = *(undefined8 *)(local_37b8->Field + 0x18);
    local_1c38[0].Field._32_8_ = *(undefined8 *)(local_37b8->Field + 0x20);
    local_1c38[0].Field._40_8_ = *(undefined8 *)(local_37b8->Field + 0x28);
    local_1c38[0].Field._48_8_ = *(undefined8 *)(local_37b8->Field + 0x30);
    local_1c38[0].Field._56_8_ = *(undefined8 *)(local_37b8->Field + 0x38);
    local_1c38[0].Dims3.field_0._0_8_ =
         (long)(local_33a0.super_extent.Dims << 0x16) >> 0xb & 0xffffffff00000000U |
         (ulong)(uint)((long)(local_33a0.super_extent.Dims << 0x2b) >> 0x2b);
    local_1c38[0].Dims3.field_0._8_4_ =
         (undefined4)((long)(local_33a0.super_extent.Dims * 2) >> 0x2b);
    local_1c38[0].DType = local_37b8->DType;
    if (local_3760->OutFile == (cstr)0x0) {
      pcVar4 = local_3760->OutDir;
      Idx2 = (idx2_file *)ToRawFileName(local_1c38);
      pcVar44 = (char *)(*in_FS_OFFSET + -0xc80);
      snprintf(pcVar44,0x400,"%s/%s-tolerance-%f.raw",pcVar4,Idx2);
    }
    else {
      pcVar44 = (char *)(*in_FS_OFFSET + -0xc80);
      snprintf(pcVar44,0x400,"%s/%s",local_3760->OutDir,local_3760->OutFile);
    }
    Vol = (mmap_volume *)local_3158;
    eVar84 = MapVolume(pcVar44,&local_1c38[0].Dims3,local_1c38[0].DType,Vol,Write);
    printf("writing output volume to %s\n",pcVar44,eVar84._8_8_);
  }
  uVar26 = (uint)Vol;
  bStack_2e90.BrickTable.Vals = (brick_volume *)0x0;
  bStack_2e90.BrickTable.Stats = (bucket_status *)0x0;
  bStack_2e90.BrickTable.Size = 0;
  bStack_2e90.BrickTable.LogCapacity = 0;
  local_2ec8._32_8_ = 0;
  local_2ec8._40_8_ = 0;
  local_2ec8._48_8_ = (allocator *)0x0;
  bStack_2e90.BrickTable.Keys = (unsigned_long *)0x0;
  local_2ec8._0_8_ = (allocator *)0x0;
  local_2ec8._8_8_ = (unsigned_long *)0x0;
  local_2ec8._16_8_ = (file_cache *)0x0;
  local_2ec8._24_8_ = (bucket_status *)0x0;
  bStack_2e90.BrickTable.Alloc = (allocator *)0x0;
  if (Mallocator()::Instance == '\0') {
    Decode();
  }
  if (Mallocator()::Instance == '\0') {
    Decode();
  }
  bStack_2e90.ResolutionLevels.Buffer.Data = (byte *)0x0;
  bStack_2e90.ResolutionLevels.Buffer.Bytes = 0;
  bStack_2e90.ResolutionLevels.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
  bStack_2e90.ResolutionLevels.Size = 0;
  bStack_2e90.ResolutionLevels.Capacity = 0;
  bStack_2e90.ResolutionLevels.Alloc = (allocator *)&Mallocator()::Instance;
  bStack_2e90.Idx2 = (idx2_file *)0x0;
  BS::thread_pool::thread_pool((thread_pool *)(local_2ec8 + 0xa0),0);
  _Stack_2cd8._16_8_ = 0;
  _Stack_2cd8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  _Stack_2cd8.__data.__list.__next = (__pthread_internal_list *)0x0;
  _Stack_2d00.__data.__list.__prev = (__pthread_internal_list *)0x0;
  _Stack_2d00.__data.__list.__next = (__pthread_internal_list *)0x0;
  _Stack_2cd8.__align = 0;
  _Stack_2cd8._8_8_ = 0;
  local_2d28.__data.__list.__next = (__pthread_internal_list *)0x0;
  _Stack_2d00.__align = 0;
  _Stack_2d00._8_8_ = 0;
  _Stack_2d00._16_8_ = 0;
  local_2d28.__align = 0;
  local_2d28._8_8_ = 0;
  local_2d28._16_8_ = 0;
  local_2d28.__data.__list.__prev = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable((condition_variable *)(local_2ec8 + 0x218));
  piVar63 = local_37b8;
  local_2c60._M_i = 0;
  aStack_2c58.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  _Stack_2c50._M_i = 0;
  _Stack_2c48._M_i = 0;
  local_2c80 = 0;
  _Stack_2c78._M_i = 0;
  _Stack_2c70._M_i = 0;
  _Stack_2c68._M_i = 0;
  local_33f8.Func.D = (decode_data *)local_2ec8;
  local_33f8.Dismissed = false;
  if (Mallocator()::Instance == '\0') {
    Decode();
  }
  Init((decode_data *)local_2ec8,piVar63,(allocator *)&Mallocator()::Instance);
  ppVar54 = local_3760;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = local_3760->DecodeTolerance;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = piVar63->Tolerance;
  auVar2 = vmaxsd_avx(auVar83,auVar2);
  local_3540 = auVar2._0_8_;
  if (Mallocator()::Instance == '\0') {
    Decode();
  }
  local_3580 = &piVar63->BrickDimsExt3;
  local_3690 = CONCAT71((int7)((ulong)Idx2 >> 8),piVar63->NLevels);
  local_35c8 = &piVar63->BricksPerChunk3s;
  local_35d0 = &piVar63->ChunksPerFile3s;
  local_35d8 = &piVar63->NFiles3;
  local_3470 = &piVar63->Subbands;
  local_34a0 = &piVar63->NBricks3;
  local_34a8 = &piVar63->DecodeSubbandSpacings;
  local_3478 = &piVar63->TransformDetails;
  local_3588 = (undefined8 *)(*in_FS_OFFSET + -0xe80);
  local_3590 = (undefined4 *)(*in_FS_OFFSET + -0xf80);
  local_3644 = (int)local_3690 + -1;
  iVar24 = (int)(char)local_3644;
  piVar71 = (iterator *)(local_3690 & 0xffffffff);
  local_36a0 = 0;
  pbVar62 = (byte *)0x0;
  lVar39 = 0;
  uVar30 = 0;
  local_3738 = uVar26;
  local_36e4 = uVar26;
  local_36e0 = uVar26;
  do {
    iVar25 = 1;
    if (1 < iVar24) {
      iVar25 = iVar24;
    }
    bVar68 = (char)piVar71 - 1;
    iVar36 = 2;
    local_3640 = iVar24;
    if ((char)bVar68 < '\0') break;
    if ('\x0f' < (char)local_3644) {
      pcVar44 = 
      "t &idx2::stack_array<unsigned char, 16>::operator[](int) const [t = unsigned char, N = 16]";
LAB_0017a068:
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,pcVar44);
    }
    local_3784 = (uint)(char)bVar68;
    local_3758 = (long)(int)local_3784;
    if ((local_37b8->DecodeSubbandMasks).Arr[local_3758] == '\0') break;
    if (bVar68 == 0) {
      local_36ec = 1;
      iVar24 = 1;
      local_36e8 = 1;
    }
    else {
      local_36ec = 1;
      iVar24 = 1;
      local_36e8 = 1;
      do {
        local_36e8 = local_36e8 * (local_37b8->GroupBrick3).field_0.field_0.Z;
        local_36ec = (local_37b8->GroupBrick3).field_0.field_0.X * local_36ec;
        iVar24 = iVar24 * (local_37b8->GroupBrick3).field_0.field_0.Y;
        iVar25 = iVar25 + -1;
      } while (iVar25 != 0);
    }
    uVar31 = (ppVar54->DecodeExtent).From;
    local_36ec = (local_37b8->BrickDims3).field_0.field_0.X * local_36ec;
    uVar67 = iVar24 * (local_37b8->BrickDims3).field_0.field_0.Y;
    local_3598 = (ulong)uVar67;
    local_36e8 = local_36e8 * (local_37b8->BrickDims3).field_0.field_0.Z;
    uVar5 = (ppVar54->DecodeExtent).Dims;
    local_3678 = local_3758 * 0xc;
    local_36b8 = (iterator *)((long)(uVar31 * 2) >> 0x2b);
    uVar65 = (long)(uVar31 << 0x16) >> 0xb;
    iVar36 = (int)uVar31 << 0xb;
    iVar37 = iVar36 >> 0xb;
    uVar26 = (((int)uVar5 << 0xb) >> 0xb) + iVar37 + -1;
    uVar69 = (uint)uVar30;
    local_36b0 = (ulong)(uVar69 | uVar26);
    uVar27 = uVar65 >> 0x20;
    uVar48 = (uint)((long)(uVar31 << 0x16) >> 0x3f);
    iVar24 = (int)(uVar31 * 2 >> 0x20);
    uVar49 = iVar24 >> 0x1f;
    local_3490 = ((uVar65 & 0xffffffff00000000) + ((long)(uVar5 << 0x16) >> 0xb) &
                 0xffffffff00000000) - 0x100000000;
    uVar28 = local_3490 >> 0x20;
    uVar50 = (uint)((long)local_3490 >> 0x3f);
    uVar53 = (int)(uVar69 | uVar26) / local_36ec - iVar37 / local_36ec;
    local_3700 = (ulong)uVar53;
    uVar80 = (uint)((long)((ulong)uVar48 << 0x20 | uVar27) / (long)(int)uVar67);
    iVar25 = (int)(uVar5 * 2 >> 0x20);
    iVar24 = (iVar25 >> 0xb) + (iVar24 >> 0xb) + -1;
    local_3780 = CONCAT44(iVar25,iVar24);
    uVar76 = (uint)((long)((ulong)uVar49 << 0x20 | (ulong)local_36b8 & 0xffffffff) /
                   (long)local_36e8);
    local_3528.From =
         (ulong)(uVar76 & 0x1fffff) << 0x2a |
         (ulong)(uVar80 & 0x1fffff) << 0x15 | (ulong)(iVar37 / local_36ec & 0x1fffff);
    iVar38 = local_35c8->Arr[local_3758].field_0.field_0.X * local_36ec;
    iVar56 = local_35c8->Arr[local_3758].field_0.field_0.Y * uVar67;
    iVar73 = local_35c8->Arr[local_3758].field_0.field_0.Z * local_36e8;
    iVar61 = local_35d0->Arr[local_3758].field_0.field_0.X * iVar38;
    iVar79 = local_35d0->Arr[local_3758].field_0.field_0.Y * iVar56;
    iVar25 = local_35d0->Arr[local_3758].field_0.field_0.Z * iVar73;
    local_3740 = CONCAT44(local_3740._4_4_,iVar25);
    iVar36 = iVar36 >> 0x1f;
    uVar30 = CONCAT44(iVar36,iVar37) / (long)iVar38;
    local_3708 = uVar30 & 0xffffffff;
    local_37b0 = CONCAT44(local_37b0._4_4_,iVar38);
    local_37a0 = CONCAT44(local_37a0._4_4_,iVar56);
    local_3790 = (brick_volume *)CONCAT44(local_3790._4_4_,iVar73);
    uVar65 = CONCAT44(iVar36,iVar37) / (long)iVar61;
    local_3748 = uVar65 & 0xffffffff;
    uVar18 = local_3748;
    uVar51 = (long)((ulong)uVar48 << 0x20 | uVar27) / (long)iVar79;
    local_3750 = uVar51 & 0xffffffff;
    uVar17 = local_3750;
    lVar52 = (long)((ulong)uVar49 << 0x20 | (ulong)local_36b8 & 0xffffffff) / (long)iVar25;
    uVar8 = (long)(int)(uVar69 | uVar26) / (long)iVar61;
    local_3778 = uVar8 & 0xffffffff;
    uVar16 = local_3778;
    uVar9 = (long)((ulong)uVar50 << 0x20 | uVar28) / (long)iVar79;
    local_3710 = uVar9 & 0xffffffff;
    uVar19 = local_3710;
    uVar70 = (ulong)(((int)((long)((ulong)uVar50 << 0x20 | uVar28) / (long)(int)uVar67) - uVar80) +
                     1 & 0x1fffff) << 0x15 | (ulong)(uVar53 + 1 & 0x1fffff);
    local_3528.Dims = (ulong)((iVar24 / local_36e8 - uVar76) + 1 & 0x1fffff) << 0x2a | uVar70;
    uVar80 = (uint)uVar30;
    uVar48 = (uint)((long)((ulong)uVar48 << 0x20 | uVar27) / (long)iVar56);
    uVar49 = (uint)((long)((ulong)uVar49 << 0x20 | (ulong)local_36b8 & 0xffffffff) / (long)iVar73);
    local_3538.From =
         (ulong)(uVar49 & 0x1fffff) << 0x2a |
         (ulong)(uVar48 & 0x1fffff) << 0x15 | (ulong)(uVar80 & 0x1fffff);
    local_3750._0_4_ = (uint)uVar51;
    local_3538.Dims =
         (ulong)((iVar24 / iVar73 - uVar49) + 1 & 0x1fffff) << 0x2a |
         (ulong)(((int)((long)((ulong)uVar50 << 0x20 | uVar28) / (long)iVar56) - uVar48) + 1 &
                0x1fffff) << 0x15 |
         (ulong)(((int)(uVar69 | uVar26) / iVar38 - uVar80) + 1 & 0x1fffff);
    local_3748._0_4_ = (uint)uVar65;
    local_36f8._0_4_ = (uint)lVar39;
    uVar26 = (((local_37b8->Dims3).field_0.field_0.X << 0xb) >> 0xb | (uint)local_36f8) - 1;
    local_3498 = (long)((ulong)(uint)(local_37b8->Dims3).field_0.field_0.Y << 0x2b) >> 0xb;
    iVar37 = (int)((ulong)(local_3498 + -0x100000000) >> 0x20);
    iVar36 = (((local_37b8->Dims3).field_0.field_0.Z << 0xb) >> 0xb) + -1;
    local_3378.Dims =
         (ulong)(iVar36 / local_36e8 + 1U & 0x1fffff) << 0x2a |
         (ulong)(iVar37 / (int)uVar67 + 1U & 0x1fffff) << 0x15 |
         (ulong)((int)((uint)local_36a0 | uVar26) / local_36ec + 1U & 0x1fffff);
    local_3378.From = 0;
    local_3388.Dims =
         (ulong)(iVar36 / iVar73 + 1U & 0x1fffff) << 0x2a |
         (ulong)(iVar37 / iVar56 + 1U & 0x1fffff) << 0x15 |
         (ulong)((int)((uint)local_36a0 | uVar26) / iVar38 + 1U & 0x1fffff);
    local_3698 = local_35c8->Arr + local_3758;
    local_3488 = local_35d0->Arr + local_3758;
    local_3778._0_4_ = (int)uVar8;
    local_3710._0_4_ = (int)uVar9;
    local_3388.From = 0;
    lVar29 = 0x28;
    do {
      *(undefined8 *)((long)local_c38 + lVar29) = 0;
      lVar29 = lVar29 + 0x30;
    } while (lVar29 != 0xc28);
    lVar29 = (long)local_35d8->Arr[local_3758].field_0.field_0.X;
    if (lVar29 == 0) {
      uVar26 = 1;
    }
    else {
      uVar30 = lVar29 - 1;
      lVar29 = 0x3f;
      if (uVar30 != 0) {
        for (; uVar30 >> lVar29 == 0; lVar29 = lVar29 + -1) {
        }
      }
      uVar26 = (uint)(1L << (-((byte)lVar29 ^ 0x3f) & 0x3f));
      if (uVar30 == 0) {
        uVar26 = 1;
      }
    }
    piVar71 = (iterator *)CONCAT71((int7)(uVar70 >> 8),bVar68);
    lVar29 = (long)local_35d8->Arr[local_3758].field_0.field_0.Y;
    if (lVar29 == 0) {
      local_36a8 = (byte *)0x100000000;
    }
    else {
      uVar30 = lVar29 - 1;
      lVar29 = 0x3f;
      if (uVar30 != 0) {
        for (; uVar30 >> lVar29 == 0; lVar29 = lVar29 + -1) {
        }
      }
      local_36a8 = (byte *)(0x100000000 << (-((byte)lVar29 ^ 0x3f) & 0x3f));
      if (uVar30 == 0) {
        local_36a8 = (byte *)0x100000000;
      }
    }
    lVar29 = (long)local_35d8->Arr[local_3758].field_0.field_0.Z;
    if (lVar29 == 0) {
      aiStack_c18[1] = 1;
    }
    else {
      uVar30 = lVar29 - 1;
      lVar29 = 0x3f;
      if (uVar30 != 0) {
        for (; uVar30 >> lVar29 == 0; lVar29 = lVar29 + -1) {
        }
      }
      aiStack_c18[1] = (int)(1L << (-((byte)lVar29 ^ 0x3f) & 0x3f));
      if (uVar30 == 0) {
        aiStack_c18[1] = 1;
      }
    }
    lVar66 = lVar52 << 0x2b;
    local_c38[0] = (local_37b8->FilesOrder).Arr[local_3758];
    local_3718._0_4_ = (uint)pbVar62;
    local_c38[1] = local_c38[0];
    uVar30 = 0;
    aiStack_c28[0] = 0;
    aiStack_c28[1] = 0;
    auStack_c20._0_4_ = 0;
    stack0xfffffffffffff3e4 = (ulong)(uVar26 | (uint)local_3718) | (ulong)local_36a8;
    auStack_c10[0] = 0;
    lVar29 = (ulong)((uint)local_3748 & 0x1fffff) << 0x2b;
    local_35b8 = lVar29 >> 0x2b;
    local_36d0 = lVar66 >> 0x2b;
    local_35c0 = (long)((ulong)((uint)local_3750 & 0x1fffff) << 0x2b) >> 0xb;
    local_35a0 = (ulong)(uint)(((int)((((int)local_3778 - (uint)local_3748) + 1) * 0x800) >> 0xb) +
                              (int)(lVar29 >> 0x2b));
    local_35b0 = (ulong)(uint)((int)((long)((ulong)((iVar24 / iVar25 - (int)lVar52) + 1) << 0x2b) >>
                                    0x2b) + (int)(lVar66 >> 0x2b));
    local_35a8 = ((long)((ulong)(((int)local_3710 - (uint)local_3750) + 1 & 0x1fffff) << 0x2b) >>
                 0xb) + local_35c0 >> 0x20;
    local_35c0 = local_35c0 >> 0x20;
    local_363c = (uint)(char)local_3690;
    local_3458 = (long)(char)local_3690;
    local_3460 = local_34a0->Arr + local_3758;
    local_3764 = local_3784 + 1;
    local_3438 = local_34a8->Arr + local_3758;
    local_3480 = (ulong)(1 << (bVar68 & 0x1f) & 0x1fffff) * 0x40000200001;
    ppVar54 = local_3760;
    piVar63 = local_37b8;
    local_3778 = uVar16;
    local_3750 = uVar17;
    local_3748 = uVar18;
    local_3720 = local_36a0;
    local_3718 = pbVar62;
    local_3710 = uVar19;
    local_36f8 = lVar39;
    local_36a0 = local_3498 + -0x100000000;
    do {
      lVar39 = uVar30 * 0x30;
      pauVar40 = (undefined1 (*) [32])(local_c38 + uVar30 * 6);
      uVar65 = *(ulong *)*pauVar40;
      uVar51 = uVar65 >> 2;
      *(ulong *)*pauVar40 = uVar51;
      uVar26 = (uint)uVar65;
      if ((~uVar26 & 3) == 0) {
        if (uVar51 == 3) {
          *(unsigned_long *)*pauVar40 = local_c38[uVar30 * 6 + 1];
        }
        else {
          local_c38[uVar30 * 6 + 1] = uVar51;
        }
        iVar36 = 5;
      }
      else {
        local_37bc = (uint)uVar30 - 1;
        iVar24 = aiStack_c28[uVar30 * 0xc];
        if (((*(int *)(auStack_c20 + lVar39 + 4) - iVar24 == 1) &&
            (iVar25 = aiStack_c28[uVar30 * 0xc + 1], aiStack_c18[uVar30 * 0xc] - iVar25 == 1)) &&
           (iVar36 = *(int *)(auStack_c20 + lVar39),
           *(int *)((long)auStack_c10 + lVar39 + -4) - iVar36 == 1)) {
          lVar39 = 0x38;
          do {
            *(undefined8 *)((long)&uStack_1c48 + lVar39) = 0;
            *(undefined4 *)((long)auStack_1c40 + lVar39) = 0;
            pcVar44 = local_1c38[0].Name + lVar39;
            pcVar44[0] = '\0';
            pcVar44[1] = '\0';
            pcVar44[2] = '\0';
            pcVar44[3] = '\0';
            pcVar44[4] = '\0';
            pcVar44[5] = '\0';
            pcVar44[6] = '\0';
            pcVar44[7] = '\0';
            lVar39 = lVar39 + 0x40;
          } while (lVar39 != 0x1038);
          local_1c38[0].Name._16_4_ = (local_3488->field_0).field_0.X;
          iVar37 = 1;
          iVar38 = 1;
          if ((long)(int)local_1c38[0].Name._16_4_ != 0) {
            uVar30 = (long)(int)local_1c38[0].Name._16_4_ - 1;
            lVar39 = 0x3f;
            if (uVar30 != 0) {
              for (; uVar30 >> lVar39 == 0; lVar39 = lVar39 + -1) {
              }
            }
            iVar38 = (int)(1L << (-((byte)lVar39 ^ 0x3f) & 0x3f));
            if (uVar30 == 0) {
              iVar38 = 1;
            }
          }
          local_1c38[0].Name._20_4_ = (local_3488->field_0).field_0.Y;
          if ((long)(int)local_1c38[0].Name._20_4_ != 0) {
            uVar30 = (long)(int)local_1c38[0].Name._20_4_ - 1;
            lVar39 = 0x3f;
            if (uVar30 != 0) {
              for (; uVar30 >> lVar39 == 0; lVar39 = lVar39 + -1) {
              }
            }
            iVar37 = (int)(1L << (-((byte)lVar39 ^ 0x3f) & 0x3f));
            if (uVar30 == 0) {
              iVar37 = 1;
            }
          }
          iVar56 = (local_3488->field_0).field_0.Z;
          if ((long)iVar56 == 0) {
            iVar61 = 1;
          }
          else {
            uVar30 = (long)iVar56 - 1;
            lVar39 = 0x3f;
            if (uVar30 != 0) {
              for (; uVar30 >> lVar39 == 0; lVar39 = lVar39 + -1) {
              }
            }
            iVar61 = (int)(1L << (-((byte)lVar39 ^ 0x3f) & 0x3f));
            if (uVar30 == 0) {
              iVar61 = 1;
            }
          }
          uVar6 = (piVar63->ChunksOrderInFile).Arr[local_3758];
          local_1c38[0].Name._16_4_ = local_1c38[0].Name._16_4_ * iVar24;
          local_1c38[0].Name._20_4_ = local_1c38[0].Name._20_4_ * iVar25;
          local_1c38[0].Name._24_4_ = iVar56 * iVar36;
          piVar71 = (iterator *)(ulong)(uint)local_1c38[0].Name._24_4_;
          local_1c38[0].Name[0] = (char)uVar6;
          local_1c38[0].Name[1] = (char)(uVar6 >> 8);
          local_1c38[0].Name[2] = (char)(uVar6 >> 0x10);
          local_1c38[0].Name[3] = (char)(uVar6 >> 0x18);
          local_1c38[0].Name[4] = (char)(uVar6 >> 0x20);
          local_1c38[0].Name[5] = (char)(uVar6 >> 0x28);
          local_1c38[0].Name[6] = (char)(uVar6 >> 0x30);
          local_1c38[0].Name[7] = (char)(uVar6 >> 0x38);
          local_1c38[0].Name[8] = (char)uVar6;
          local_1c38[0].Name[9] = (char)(uVar6 >> 8);
          local_1c38[0].Name[10] = (char)(uVar6 >> 0x10);
          local_1c38[0].Name[0xb] = (char)(uVar6 >> 0x18);
          local_1c38[0].Name[0xc] = (char)(uVar6 >> 0x20);
          local_1c38[0].Name[0xd] = (char)(uVar6 >> 0x28);
          local_1c38[0].Name[0xe] = (char)(uVar6 >> 0x30);
          local_1c38[0].Name[0xf] = (char)(uVar6 >> 0x38);
          local_1c38[0].Name._28_4_ = iVar38 + local_1c38[0].Name._16_4_;
          local_1c38[0].Name._32_4_ = iVar37 + local_1c38[0].Name._20_4_;
          local_1c38[0].Name._36_4_ = iVar61 + local_1c38[0].Name._24_4_;
          uVar30 = 0;
          local_1c38[0].Name[0x28] = '\0';
          local_1c38[0].Name[0x29] = '\0';
          local_1c38[0].Name[0x2a] = '\0';
          local_1c38[0].Name[0x2b] = '\0';
          local_1c38[0].Name[0x2c] = '\0';
          local_1c38[0].Name[0x2d] = '\0';
          local_1c38[0].Name[0x2e] = '\0';
          local_1c38[0].Name[0x2f] = '\0';
          local_1c38[0].Name._48_8_ = local_1c38[0].Name._48_8_ & 0xffffffff00000000;
          local_1c38[0].Name[0x38] = '\0';
          local_1c38[0].Name[0x39] = '\0';
          local_1c38[0].Name[0x3a] = '\0';
          local_1c38[0].Name[0x3b] = '\0';
          local_1c38[0].Name[0x3c] = '\0';
          local_1c38[0].Name[0x3d] = '\0';
          local_1c38[0].Name[0x3e] = '\0';
          local_1c38[0].Name[0x3f] = '\0';
          do {
            lVar39 = uVar30 * 0x40;
            piVar55 = (iterator *)(local_1c38[0].Name + lVar39);
            uVar65 = (ulong)piVar55->Key;
            uVar51 = uVar65 >> 2;
            piVar55->Key = (unsigned_long *)uVar51;
            uVar26 = (uint)uVar65;
            if ((~uVar26 & 3) == 0) {
              if (uVar51 == 3) {
                piVar55->Key = (unsigned_long *)*(undefined8 *)(local_1c38[0].Name + lVar39 + 8);
              }
              else {
                *(ulong *)(local_1c38[0].Name + lVar39 + 8) = uVar51;
              }
              iVar36 = 7;
LAB_00179d48:
              uVar72 = (undefined7)((ulong)piVar71 >> 8);
            }
            else {
              local_376c = (int)uVar30 - 1;
              iVar24 = *(int *)(local_1c38[0].Name + lVar39 + 0x10);
              if (((*(int *)(local_1c38[0].Name + lVar39 + 0x1c) - iVar24 == 1) &&
                  (iVar25 = *(int *)(local_1c38[0].Name + lVar39 + 0x14),
                  *(int *)(local_1c38[0].Name + lVar39 + 0x20) - iVar25 == 1)) &&
                 (iVar36 = *(int *)(local_1c38[0].Name + lVar39 + 0x18),
                 *(int *)(local_1c38[0].Field + lVar39 + -0x1c) - iVar36 == 1)) {
                lVar39 = 0x38;
                do {
                  *(undefined8 *)((long)auStack_2c40 + lVar39 + -8) = 0;
                  *(undefined4 *)((long)auStack_2c40 + lVar39) = 0;
                  *(undefined8 *)((long)&local_2c38.Key + lVar39) = 0;
                  lVar39 = lVar39 + 0x40;
                } while (lVar39 != 0x1038);
                iVar37 = (local_3698->field_0).field_0.X;
                iVar38 = 1;
                iVar56 = 1;
                if ((long)iVar37 != 0) {
                  uVar30 = (long)iVar37 - 1;
                  lVar39 = 0x3f;
                  if (uVar30 != 0) {
                    for (; uVar30 >> lVar39 == 0; lVar39 = lVar39 + -1) {
                    }
                  }
                  iVar56 = (int)(1L << (-((byte)lVar39 ^ 0x3f) & 0x3f));
                  if (uVar30 == 0) {
                    iVar56 = 1;
                  }
                }
                iVar61 = (local_3698->field_0).field_0.Y;
                if ((long)iVar61 != 0) {
                  uVar30 = (long)iVar61 - 1;
                  lVar39 = 0x3f;
                  if (uVar30 != 0) {
                    for (; uVar30 >> lVar39 == 0; lVar39 = lVar39 + -1) {
                    }
                  }
                  iVar38 = (int)(1L << (-((byte)lVar39 ^ 0x3f) & 0x3f));
                  if (uVar30 == 0) {
                    iVar38 = 1;
                  }
                }
                iVar73 = (local_3698->field_0).field_0.Z;
                if ((long)iVar73 == 0) {
                  iVar79 = 1;
                }
                else {
                  uVar30 = (long)iVar73 - 1;
                  lVar39 = 0x3f;
                  if (uVar30 != 0) {
                    for (; uVar30 >> lVar39 == 0; lVar39 = lVar39 + -1) {
                    }
                  }
                  iVar79 = (int)(1L << (-((byte)lVar39 ^ 0x3f) & 0x3f));
                  if (uVar30 == 0) {
                    iVar79 = 1;
                  }
                }
                local_2c38.Key = (unsigned_long *)(piVar63->BricksOrderInChunk).Arr[local_3758];
                local_2c38.Ht._0_4_ = iVar37 * iVar24;
                Val = (brick_volume *)(ulong)(uint)local_2c38.Ht;
                local_2c38.Ht._4_4_ = iVar61 * iVar25;
                local_2c38.Idx._0_4_ = iVar73 * iVar36;
                piVar71 = (iterator *)(ulong)(uint)local_2c38.Idx;
                local_2c38.Val = (brick_volume *)local_2c38.Key;
                local_2c38.Idx._4_4_ = iVar56 + (uint)local_2c38.Ht;
                uStack_2c18._0_4_ = iVar38 + local_2c38.Ht._4_4_;
                uStack_2c18._4_4_ = iVar79 + (uint)local_2c38.Idx;
                uVar30 = 0;
                uStack_2c10 = 0;
                auStack_2c08[0] = auStack_2c08[0] & 0xffffffff00000000;
                auStack_2c08[1] = 0;
                do {
                  Vol_00 = &local_3518;
                  uVar80 = (uint)uVar30;
                  piVar55 = &local_2c38 + uVar30 * 2;
                  Brick3_00.field_0._0_8_ = piVar55->Key;
                  pbVar41 = (brick_volume *)((ulong)Brick3_00.field_0._0_8_ >> 2);
                  piVar55->Key = (unsigned_long *)pbVar41;
                  uVar26 = (uint)Brick3_00.field_0._0_8_;
                  if ((~uVar26 & 3) == 0) {
                    if (pbVar41 == (brick_volume *)0x3) {
                      piVar55->Key = (unsigned_long *)(&local_2c38)[uVar30 * 2].Val;
                    }
                    else {
                      (&local_2c38)[uVar30 * 2].Val = pbVar41;
                    }
                    iVar36 = 9;
                    local_3794 = uVar80;
                  }
                  else {
                    local_3794 = uVar80 - 1;
                    local_3688 = piVar55;
                    if (((*(int *)((long)&(&local_2c38)[uVar30 * 2].Idx + 4) -
                          *(int *)&(&local_2c38)[uVar30 * 2].Ht == 1) &&
                        (*(int *)(&uStack_2c18 + uVar30 * 8) -
                         *(int *)((long)&(&local_2c38)[uVar30 * 2].Ht + 4) == 1)) &&
                       (*(int *)((long)&uStack_2c18 + uVar30 * 0x40 + 4) -
                        (int)(&local_2c38)[uVar30 * 2].Idx == 1)) {
                      local_3638 = (int)auStack_2c08[uVar30 * 8];
                      if (Mallocator()::Instance == '\0') {
                        Decode();
                      }
                      local_3518.Vol.Buffer.Data = (byte *)0x0;
                      local_3518.Vol.Buffer.Bytes = 0;
                      local_3518.Vol.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
                      local_3518.Vol.Dims = 0;
                      local_3518.Vol.Type = __Invalid__;
                      local_3518.ExtentLocal.From = 0;
                      local_3518.ExtentLocal.Dims = 0;
                      local_3518.NChildrenDecoded = '\0';
                      local_3518.NChildrenMax = '\0';
                      local_3518.Significant = false;
                      local_3518.DoneDecoding = false;
                      Resize(&Vol_00->Vol,local_3580,float64,(allocator *)local_2ec8._0_8_);
                      lVar52 = (long)(local_3518.Vol.Dims * 2) >> 0x2b;
                      lVar39 = (long)(local_3518.Vol.Dims << 0x16) >> 0x2b;
                      if (lVar39 != 0 && (lVar52 != 0 && (local_3518.Vol.Dims & 0x1fffff) != 0)) {
                        memset(local_3518.Vol.Buffer.Data,0,
                               lVar52 * lVar39 * ((long)(local_3518.Vol.Dims << 0x2b) >> 0x2b) * 8);
                      }
                      iVar24 = *(int *)&(&local_2c38)[uVar30 * 2].Ht;
                      local_3734 = *(int *)((long)&(&local_2c38)[uVar30 * 2].Ht + 4);
                      local_3768 = (uint)(&local_2c38)[uVar30 * 2].Idx;
                      Brick3.field_0.field_0.Y = 0;
                      Brick3.field_0.field_0.X = local_3768;
                      Brick3.field_0._8_4_ = SUB84(Val,0);
                      local_3750 = GetLinearBrick((idx2 *)piVar63,(idx2_file *)(ulong)local_3784,
                                                  (int)(&local_2c38)[uVar30 * 2].Ht,Brick3);
                      phVar78 = (hash_table<short,_idx2::bitstream> *)
                                (local_3750 * 0x10 + local_3758);
                      this = (idx2 *)(local_2ec8 + 0x38);
                      local_36dc = iVar24;
                      local_3670 = (undefined1  [8])phVar78;
                      Insert<unsigned_long,idx2::brick_volume>
                                (&local_2ee8,this,
                                 (hash_table<unsigned_long,_idx2::brick_volume> *)local_3670,
                                 (unsigned_long *)Vol_00,Val);
                      local_3358.Keys = (unsigned_long *)phVar78;
                      Lookup<unsigned_long,idx2::brick_volume>
                                (&local_3108,this,&local_3358,(unsigned_long *)Vol_00);
                      local_3578 = local_3108.Val;
                      local_33e8.LogCapacity = 0;
                      local_33e8.Alloc = (allocator *)0x0;
                      local_33e8.Keys = (short *)0x0;
                      local_33e8.Vals = (bitstream *)0x0;
                      local_33e8.Stats = (bucket_status *)0x0;
                      local_33e8.Size = 0;
                      if (Mallocator()::Instance == '\0') {
                        Decode();
                      }
                      piVar57 = (idx2 *)0x7;
                      uVar32 = &local_33e8;
                      Init<short,idx2::bitstream>
                                ((hash_table<short,_idx2::bitstream> *)uVar32,7,
                                 (allocator *)&Mallocator()::Instance);
                      bVar82 = (char)(piVar63->Subbands).Size == '\0';
                      local_3730 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),bVar82);
                      if (!bVar82) {
                        local_3730 = 0;
                        uVar26 = 0;
                        local_37a8 = 0;
                        do {
                          iVar25 = local_36dc;
                          iVar24 = local_3734;
                          if (((piVar63->DecodeSubbandMasks).Arr[local_3758] >> (uVar26 & 0x1f) & 1)
                              != 0) {
                            local_3428 = (long)(char)local_37a8;
                            pbVar62 = (piVar63->Subbands).Buffer.Data;
                            local_3680 = (undefined1 (*) [16])(pbVar62 + local_3428 * 0x40);
                            lVar39 = *(long *)(pbVar62 + local_3428 * 0x40 + 8);
                            iVar36 = (int)((lVar39 << 0x16) >> 0x2b);
                            local_3448 = (hash_table<short,_idx2::bitstream> *)uVar32;
                            local_3440 = piVar57;
                            if (((char)local_37a8 == '\0') && ((char)local_3690 < piVar63->NLevels))
                            {
                              local_3790 = (brick_volume *)CONCAT71(local_3790._1_7_,1 < iVar36);
                              local_37b0 = CONCAT71(local_37b0._1_7_,1 < lVar39 * 2 >> 0x2b);
                              Brick3_00.field_0._0_8_ =
                                   (unsigned_long *)
                                   ((long)(int)local_3768 /
                                    (long)(piVar63->GroupBrick3).field_0.field_0.Z & 0xffffffff);
                              Brick3_00.field_0._8_4_ =
                                   (int)((long)local_36dc /
                                        (long)(piVar63->GroupBrick3).field_0.field_0.X);
                              uVar31 = GetLinearBrick((idx2 *)piVar63,(idx2_file *)(ulong)local_363c
                                                      ,Brick3_00.field_0._8_4_,Brick3_00);
                              local_3618._0_8_ = uVar31 * 0x10 + local_3458;
                              Lookup<unsigned_long,idx2::brick_volume>
                                        ((iterator *)&local_3358,(idx2 *)(local_2ec8 + 0x38),
                                         (hash_table<unsigned_long,_idx2::brick_volume> *)local_3618
                                         ,Brick3_00.field_0._0_8_);
                              piVar63 = local_37b8;
                              local_37a0 = CONCAT71(local_37a0._1_7_,1 < (lVar39 << 0x2b) >> 0x2b);
                              uVar26 = (local_37b8->GroupBrick3).field_0.field_0.X;
                              uVar80 = (local_37b8->GroupBrick3).field_0.field_0.Y;
                              uVar48 = (local_37b8->GroupBrick3).field_0.field_0.Z;
                              local_30e8.Val =
                                   (brick_volume *)
                                   ((ulong)(uVar48 & 0x1fffff) << 0x2a |
                                   ((ulong)uVar80 & 0x1fffff) << 0x15 | (ulong)uVar26 & 0x1fffff);
                              local_30e8.Key =
                                   (unsigned_long *)
                                   ((ulong)(local_3768 - (int)local_3768 % (int)uVar48 & 0x1fffff)
                                    << 0x2a |
                                   (ulong)(iVar24 - iVar24 % (int)uVar80 & 0x1fffff) << 0x15 |
                                   (ulong)(iVar25 - iVar25 % (int)uVar26 & 0x1fffff));
                              auVar14._8_8_ = 0;
                              auVar14._0_8_ =
                                   (ulong)((local_3460->field_0).field_0.Z & 0x1fffff) << 0x2a |
                                   ((ulong)(uint)(local_3460->field_0).field_0.Y & 0x1fffff) << 0x15
                                   | (ulong)(uint)(local_3460->field_0).field_0.X & 0x1fffff;
                              _local_35f8 = (extent)(auVar14 << 0x40);
                              eVar85 = Crop<idx2::extent,idx2::extent>
                                                 ((extent *)&local_30e8,(extent *)local_35f8);
                              uVar80 = (int)((lVar39 << 0x2b) >> 0x2b) - (uint)(byte)local_37a0;
                              uVar26 = iVar36 - (uint)(byte)local_3790;
                              uVar48 = (int)(lVar39 * 2 >> 0x2b) - (uint)(byte)local_37b0;
                              aStack_35f0._8_8_ = *(undefined8 *)local_3680[1];
                              local_3668.Val =
                                   (bitstream *)
                                   ((ulong)(uVar48 & 0x1fffff) << 0x2a |
                                   (ulong)(uVar26 & 0x1fffff) << 0x15 | (ulong)(uVar80 & 0x1fffff));
                              local_35f8 = SUB168(*local_3680,0);
                              aStack_35f0.Val = (chunk_exp_cache *)local_3668.Val;
                              local_3668.Key =
                                   (short *)((ulong)(((int)local_3768 %
                                                     (piVar63->GroupBrick3).field_0.field_0.Z) *
                                                     uVar48 & 0x1fffff) << 0x2a |
                                            (ulong)((local_3734 %
                                                    (piVar63->GroupBrick3).field_0.field_0.Y) *
                                                    uVar26 & 0x1fffff) << 0x15 |
                                            (ulong)((iVar25 % (piVar63->GroupBrick3).field_0.field_0
                                                              .X) * uVar80 & 0x1fffff));
                              CopyExtentGrid<double,double>
                                        ((extent *)(local_3670 + 8),&(local_3358.Vals)->Vol,
                                         (grid *)local_35f8,&local_3578->Vol);
                              piVar55 = local_3688;
                              piVar63 = local_37b8;
                              if (((local_36dc ==
                                    (((int)eVar85.Dims << 0xb) >> 0xb) +
                                    (((int)eVar85.From << 0xb) >> 0xb) + -1) &&
                                  ((uVar30 = ((long)(eVar85.Dims << 0x16) >> 0xb) + -0x100000000 +
                                             ((long)(eVar85.From << 0x16) >> 0xb &
                                             0xffffffff00000000U),
                                   Brick3_00.field_0._0_8_ = (unsigned_long *)(uVar30 >> 0x20),
                                   local_3734 == (int)(uVar30 >> 0x20) &&
                                   (((int)((long)(eVar85.Dims * 2) >> 0x2b) +
                                    (int)((long)(eVar85.From * 2) >> 0x2b)) - 1U == local_3768))))
                                 && ((local_3760->OutMode != HashMap ||
                                     ((local_3358.Vals)->Significant == false)))) {
                                Dealloc(local_3358.Vals);
                                Delete<unsigned_long,idx2::brick_volume>
                                          (&local_30e8,(idx2 *)(local_2ec8 + 0x38),
                                           (hash_table<unsigned_long,_idx2::brick_volume> *)
                                           local_3618,Brick3_00.field_0._0_8_);
                                piVar63 = local_37b8;
                              }
                            }
                            lVar39 = *(long *)(*local_3680 + 8);
                            local_3568 = lVar39 * 2 >> 0x2b;
                            uVar26 = ((int)lVar39 << 0xb) >> 0xb;
                            local_3558 = (ulong)uVar26;
                            local_3560 = (ulong)((lVar39 << 0x16) >> 0xb) >> 0x20;
                            iVar24 = (piVar63->BlockDims3).field_0.field_0.X;
                            iVar25 = (piVar63->BlockDims3).field_0.field_0.Y;
                            iVar36 = (piVar63->BlockDims3).field_0.field_0.Z;
                            iVar37 = (int)((ulong)(lVar39 << 0x16) >> 0x20);
                            iVar38 = (int)((ulong)(lVar39 * 2) >> 0x20);
                            uVar30 = (long)(int)(iVar24 + -1 + uVar26) / (long)iVar24;
                            piVar71 = (iterator *)(uVar30 & 0xffffffff);
                            uVar65 = (long)(iVar25 + -1 + (iVar37 >> 0xb)) / (long)iVar25;
                            local_3548 = uVar65 & 0xffffffff;
                            uVar51 = (long)((iVar38 >> 0xb) + iVar36 + -1) / (long)iVar36;
                            local_3550 = uVar51 & 0xffffffff;
                            iVar56 = (int)uVar30 * (int)uVar51 * (int)uVar65;
                            local_3790 = local_3108.Val;
                            if (((char)local_37a8 == '\0') && (local_3764 < piVar63->NLevels)) {
                              iVar56 = iVar56 - (int)((long)((ulong)(uint)(iVar38 >> 0x1f) << 0x20 |
                                                            local_3568 & 0xffffffff) / (long)iVar36)
                                                * ((int)uVar26 / iVar24) *
                                                (int)((long)((ulong)(uint)(iVar37 >> 0x1f) << 0x20 |
                                                            local_3560) / (long)iVar25);
                            }
                            Val = (brick_volume *)(ulong)local_3784;
                            local_3708 = CONCAT44(local_3708._4_4_,(int)(char)local_37a8);
                            local_36b8 = piVar71;
                            ReadChunkExponents((expected<const_idx2::chunk_exp_cache_*,_idx2::idx2_err_code>
                                                *)local_35f8,piVar63,(decode_data *)local_2ec8,
                                               local_3750,(i8)local_3784,(char)local_37a8);
                            uVar32 = aStack_35f0.Val;
                            uVar77 = aStack_35f0._8_8_;
                            cVar35 = local_35e0;
                            if (local_35e0 != false) {
                              bVar45 = piVar63->DType - int64;
                              bVar23 = 0;
                              if (bVar45 < 4) {
                                bVar23 = (byte)(&DAT_001a8430)[bVar45];
                              }
                              local_37a4[3] = local_35e0;
                              pbVar81 = (bitstream *)((aStack_35f0.Val)->ChunkExpStream).Stream.Data
                              ;
                              lVar39 = (long)(iVar56 * local_3638 << (bVar23 & 0x1f));
                              local_36c0 = *(ulong *)((long)&(pbVar81->Stream).Data + lVar39);
                              local_33e8.Size = 0;
                              if (local_33e8.LogCapacity != 0x3f) {
                                __n = 1L << ((byte)local_33e8.LogCapacity & 0x3f);
                                if ((long)__n < 2) {
                                  __n = 1;
                                }
                                memset(local_33e8.Stats,0,__n);
                              }
                              local_36c8 = (long)&(pbVar81->Stream).Data + lVar39;
                              uVar48 = (int)local_36b8 - 1;
                              uVar80 = (int)local_3548 - 1;
                              uVar26 = (int)local_3550 - 1;
                              uVar48 = (uVar48 * 0x100 & 0xffff | uVar48 * 0x10000 | uVar48 & 0xff)
                                       & 0x300f00f;
                              uVar80 = (uVar80 * 0x100 & 0xffff | uVar80 * 0x10000 | uVar80 & 0xff)
                                       & 0x300f00f;
                              uVar26 = (uVar26 * 0x100 & 0xffff | uVar26 * 0x10000 | uVar26 & 0xff)
                                       & 0x300f00f;
                              local_361c = ((uVar26 << 4 | uVar26) & 0x30c30c3) * 0x14 & 0x24924924
                                           | ((uVar80 << 4 | uVar80) & 0x30c30c3) * 10 & 0x12492492
                                             | ((uVar48 << 4 | uVar48) & 0x30c30c3) * 5 & 0x9249249;
                              Val = (brick_volume *)0x0;
                              local_3728 = 0;
                              local_372c = 0;
                              do {
                                uVar80 = (uint)Val;
                                uVar48 = (uVar80 & 0x9249249) >> 2 | uVar80 & 0x9249249;
                                uVar26 = uVar48 & 0x30c30c3;
                                uVar26 = (uVar26 >> 4 | uVar26) & 0x300f00f;
                                uVar26 = (uVar48 >> 0x10 & 0x300 | uVar26 >> 8 | uVar26) & 0x3ff;
                                if ((int)local_36b8 <= (int)uVar26) {
LAB_001788a7:
                                  iVar24 = 0;
                                  if (uVar80 != 0) {
                                    for (; (uVar80 >> iVar24 & 1) == 0; iVar24 = iVar24 + 1) {
                                    }
                                  }
                                  bVar23 = (char)iVar24 + 1;
                                  if (uVar80 == 0) {
                                    bVar23 = (byte)Val;
                                  }
                                  uVar26 = (uVar80 >> (bVar23 & 0x1f)) + 1 << (bVar23 & 0x1f);
                                  goto LAB_001795eb;
                                }
                                uVar50 = (uint)((ulong)Val >> 1) & 0x9249249;
                                local_3400 = (ulong)(uVar50 >> 2);
                                uVar49 = (uVar50 >> 2) + uVar50;
                                uVar48 = uVar49 & 0x30c30c3;
                                local_3620 = (uVar48 >> 4 | uVar48) & 0x300f00f;
                                local_3624 = local_3620 >> 8;
                                uVar48 = (uVar49 >> 0x10 & 0x300 | local_3624 | local_3620) & 0x3ff;
                                if ((int)local_3548 <= (int)uVar48) goto LAB_001788a7;
                                uVar49 = (uint)((ulong)Val >> 2) & 0x9249248;
                                local_3408 = (ulong)uVar49;
                                piVar55 = (iterator *)(ulong)(uVar80 & 0x24924924);
                                uVar49 = uVar49 + (uVar80 & 0x24924924);
                                uVar53 = uVar49 >> 2 & 0x30c30c3;
                                local_3628 = (uVar53 >> 4 | uVar53) & 0x300f00f;
                                uVar53 = local_3628 >> 8;
                                uVar49 = (uVar49 >> 0x12 & 0x300 | uVar53 | local_3628) & 0x3ff;
                                piVar71 = piVar55;
                                if ((int)local_3550 <= (int)uVar49) goto LAB_001788a7;
                                iVar24 = (piVar63->BlockDims3).field_0.field_0.X;
                                local_36d4 = (piVar63->BlockDims3).field_0.field_0.Y;
                                local_36d8 = (piVar63->BlockDims3).field_0.field_0.Z;
                                iVar36 = uVar49 * local_36d8;
                                iVar38 = uVar26 * iVar24;
                                local_3700 = CONCAT44(local_3700._4_4_,iVar38);
                                iVar37 = uVar48 * local_36d4;
                                pbVar62 = (local_3438->Buffer).Data;
                                piVar71 = (iterator *)(local_3428 * 3);
                                local_36b0 = CONCAT71(local_36b0._1_7_,
                                                      (iVar37 % *(int *)(pbVar62 +
                                                                        local_3428 * 0xc + 4) != 0
                                                      || iVar38 % *(int *)(pbVar62 +
                                                                          local_3428 * 0xc) != 0) ||
                                                      iVar36 % *(int *)(pbVar62 +
                                                                       local_3428 * 0xc + 8) != 0);
                                iVar38 = (int)local_3558 - iVar38;
                                iVar37 = (int)local_3560 - iVar37;
                                iVar36 = (int)local_3568 - iVar36;
                                iVar25 = iVar24;
                                if (iVar38 < iVar24) {
                                  iVar25 = iVar38;
                                }
                                local_37b0 = CONCAT44(local_37b0._4_4_,iVar25);
                                iVar56 = local_36d4;
                                if (iVar37 < local_36d4) {
                                  iVar56 = iVar37;
                                }
                                local_36f8 = CONCAT44(local_36f8._4_4_,iVar56);
                                iVar61 = local_36d8;
                                if (iVar36 < local_36d8) {
                                  iVar61 = iVar36;
                                }
                                local_3724 = uVar80;
                                local_362c = uVar53;
                                local_3420 = piVar55;
                                local_3418 = (ulong)uVar50;
                                if (((((char)local_37a8 == '\0') && (local_3764 < piVar63->NLevels))
                                    && (iVar24 <= iVar38)) &&
                                   ((local_36d4 <= iVar37 && (local_36d8 <= iVar36))))
                                goto LAB_001795e8;
                                uVar80 = (uint)(1 < iVar61) +
                                         (uint)(1 < iVar56) + (uint)(1 < iVar25);
                                uVar26 = 1 << (char)uVar80 * '\x02';
                                uVar30 = (ulong)uVar26;
                                local_3634 = iVar61;
                                memset(&local_30e8,0,0x200);
                                dVar47 = piVar63->DType;
                                if ((dVar47 < 10) && ((0x2c0U >> (dVar47 & 0x1f) & 1) != 0)) {
                                  if (0x30 < (int)local_3728) {
                                    local_36c0 = *(ulong *)(local_36c8 + (ulong)(local_3728 >> 3));
                                    local_36c8 = (ulong)(local_3728 >> 3) + local_36c8;
                                    local_3728 = local_3728 & 7;
                                  }
                                  uVar75 = (ushort)(local_36c0 >> ((byte)local_3728 & 0x3f)) &
                                           (ushort)bitstream::Masks.Arr[0x10];
                                  local_3728 = local_3728 + 0x10;
                                  iVar24 = -0x3ff;
                                }
                                else {
                                  if (0x38 < (int)local_3728) {
                                    local_36c0 = *(ulong *)(local_36c8 + (ulong)(local_3728 >> 3));
                                    local_36c8 = (ulong)(local_3728 >> 3) + local_36c8;
                                    local_3728 = local_3728 & 7;
                                  }
                                  uVar75 = (ushort)(local_36c0 >> ((byte)local_3728 & 0x3f)) &
                                           (ushort)bitstream::Masks.Arr[8];
                                  local_3728 = local_3728 + 8;
                                  iVar24 = -0x7f;
                                }
                                local_37bd = '\0';
                                switch(dVar47) {
                                case int8:
                                case uint8:
                                  local_3778 = CONCAT44(local_3778._4_4_,0x38);
                                  break;
                                case int16:
                                case uint16:
                                  local_3778 = CONCAT44(local_3778._4_4_,0x30);
                                  break;
                                case int32:
                                case uint32:
                                case float32:
                                  local_3778 = CONCAT44(local_3778._4_4_,0x20);
                                  break;
                                case int64:
                                case uint64:
                                case float64:
                                  bVar82 = false;
                                  local_3778 = (ulong)local_3778._4_4_ << 0x20;
                                  goto LAB_00178a27;
                                default:
                                  local_3778 = CONCAT44(local_3778._4_4_,0x40);
                                  bVar82 = true;
                                  goto LAB_00178a27;
                                }
                                bVar82 = false;
LAB_00178a27:
                                local_3430 = (ulong)uVar80;
                                if ((local_3540 != 0.0) || (NAN(local_3540))) {
                                  frexp(local_3540,(int *)(local_3670 + 8));
                                  iVar25 = (int)local_3668.Key;
                                  if ((int)local_3668.Key < -0x3fd) {
                                    iVar25 = -0x3fe;
                                  }
                                  iVar25 = iVar25 + -6;
                                }
                                else {
                                  iVar25 = -0x405;
                                }
                                local_3740 = (ulong)(uint)((short)uVar75 + iVar24);
                                local_3630 = (int)(short)((short)uVar75 + iVar24);
                                uVar80 = iVar25 - local_3630;
                                local_37a0 = CONCAT44(local_37a0._4_4_,uVar80);
                                local_3748 = uVar30;
                                if (bVar82) {
                                  local_3720 = (ulong)local_3720._4_4_ << 0x20;
                                }
                                else {
                                  local_3710 = CONCAT44(local_3710._4_4_,piVar63->BitPlanesPerChunk)
                                  ;
                                  cVar35 = '?';
                                  iVar24 = 0x3f;
                                  local_3720 = (ulong)local_3720._4_4_ << 0x20;
                                  do {
                                    Key = (short *)(ulong)uVar80;
                                    iVar36 = (int)(short)((short)local_3740 + (short)iVar24);
                                    iVar25 = iVar36 + 0x400;
                                    local_37a4._0_2_ = (undefined2)(iVar25 / (int)local_3710);
                                    iVar25 = iVar25 % (int)local_3710;
                                    if ((local_3540 != 0.0) || (NAN(local_3540))) {
                                      frexp(local_3540,(int *)(local_3670 + 8));
                                      Key = (short *)0xfffffc02;
                                      iVar37 = (int)local_3668.Key;
                                      if ((int)local_3668.Key < -0x3fd) {
                                        iVar37 = -0x3fe;
                                      }
                                    }
                                    else {
                                      iVar37 = -0x3ff;
                                    }
                                    iVar36 = iVar36 - iVar37;
                                    if ((0x38 < iVar36) || (bVar82 = true, iVar25 != 0)) {
                                      Lookup<short,idx2::bitstream>
                                                ((iterator *)(local_3670 + 8),(idx2 *)&local_33e8,
                                                 (hash_table<short,_idx2::bitstream> *)local_37a4,
                                                 Key);
                                      uVar65 = local_3750;
                                      pbVar81 = local_3668.Val;
                                      if (*(char *)(*(long *)((long)local_3668.Ht + 0x10) +
                                                   local_3668.Idx) == '\x02') {
LAB_00178c9c:
                                        local_3678 = CONCAT71(local_3678._1_7_,0x38 < iVar36);
                                        pbVar62 = (pbVar81->Stream).Data;
                                        local_3718 = pbVar81->BitPtr;
                                        uVar80 = pbVar81->BitPos;
                                        local_3780 = (ulong)uVar80;
                                        if ((int)(uint)local_37a0 < 8) {
                                          Decode<unsigned_long>
                                                    ((unsigned_long *)&local_30e8,(int)uVar30,iVar24
                                                     ,&local_37bd,pbVar81,(bool)(byte)local_36b0);
                                        }
                                        else {
                                          local_3618._16_8_ = (pbVar81->Stream).Alloc;
                                          local_3618._0_8_ = (pbVar81->Stream).Data;
                                          local_3618._8_8_ = (pbVar81->Stream).Bytes;
                                          pbVar15 = (pbVar81->Stream).Data;
                                          iVar11 = (pbVar81->Stream).Bytes;
                                          uVar65 = pbVar81->BitBuf;
                                          uVar48 = (uint)local_37bd;
                                          pbVar60 = local_3718;
                                          if ((int)uVar48 < 1) {
                                            Brick3_00.field_0._0_8_ = (unsigned_long *)0x0;
                                            uVar51 = local_3780;
                                          }
                                          else {
                                            uVar50 = 0x40 - uVar80;
                                            uVar49 = uVar48;
                                            if ((int)uVar50 < (int)uVar48) {
                                              uVar49 = uVar50;
                                            }
                                            if (0x40 < (int)uVar49) {
LAB_0017a053:
                                              pcVar44 = 
                                              "t &idx2::stack_array<unsigned long, 65>::operator[](int) const [t = unsigned long, N = 65]"
                                              ;
                                              goto LAB_0017a068;
                                            }
                                            Brick3_00.field_0._0_8_ =
                                                 (unsigned_long *)
                                                 (uVar65 >> ((byte)uVar80 & 0x3f) &
                                                 bitstream::Masks.Arr[(int)uVar49]);
                                            uVar80 = uVar49 + uVar80;
                                            uVar51 = (ulong)uVar80;
                                            if ((int)uVar50 < (int)uVar48) {
                                              iVar25 = uVar48 - uVar49;
                                              if (0x40 < iVar25) goto LAB_0017a053;
                                              local_3410 = (long)((int)uVar80 >> 3);
                                              uVar65 = *(ulong *)(local_3718 + local_3410);
                                              piVar71 = (iterator *)
                                                        ((uVar65 >> (sbyte)(uVar80 & 7) &
                                                         bitstream::Masks.Arr[iVar25]) <<
                                                        ((byte)uVar49 & 0x3f));
                                              Brick3_00.field_0._0_8_ =
                                                   (unsigned_long *)
                                                   ((ulong)Brick3_00.field_0._0_8_ | (ulong)piVar71)
                                              ;
                                              uVar51 = (ulong)((uVar80 & 7) + iVar25);
                                              uVar30 = local_3748;
                                              pbVar60 = local_3718 + local_3410;
                                            }
                                          }
                                          uVar80 = (uint)uVar51;
                                          uVar49 = uVar48;
                                          while ((int)uVar49 < (int)uVar30) {
                                            uVar49 = (uint)uVar51;
                                            if (0x3f < (int)uVar49) {
                                              uVar65 = *(ulong *)(pbVar60 + (uVar51 >> 3));
                                              pbVar60 = pbVar60 + (uVar51 >> 3);
                                              uVar49 = uVar49 & 7;
                                            }
                                            uVar80 = uVar49 + 1;
                                            uVar51 = (ulong)uVar80;
                                            if ((uVar65 >> ((byte)uVar49 & 0x3f) &
                                                bitstream::Masks.Arr[1]) == 0) break;
                                            while( true ) {
                                              uVar80 = (uint)uVar51;
                                              bVar23 = (byte)uVar48;
                                              if ((int)(uVar26 - 1) <= (int)(char)bVar23) break;
                                              if (0x3f < (int)uVar80) {
                                                uVar65 = *(ulong *)(pbVar60 + (uVar51 >> 3));
                                                pbVar60 = pbVar60 + (uVar51 >> 3);
                                                uVar80 = uVar80 & 7;
                                              }
                                              uVar51 = (ulong)(uVar80 + 1);
                                              if ((uVar65 >> ((byte)uVar80 & 0x3f) &
                                                  bitstream::Masks.Arr[1]) != 0) break;
                                              uVar48 = (uint)(byte)(bVar23 + 1);
                                            }
                                            uVar80 = (uint)uVar51;
                                            uVar48 = uVar48 + 1;
                                            local_37bd = (i8)uVar48;
                                            piVar71 = (iterator *)(1L << (bVar23 & 0x3f));
                                            Brick3_00.field_0._0_8_ =
                                                 (unsigned_long *)
                                                 ((long)&piVar71->Key +
                                                 (long)Brick3_00.field_0._0_8_);
                                            uVar49 = (uint)local_37bd;
                                          }
                                          (&local_30e8.Key)[0x3f - iVar24] = Brick3_00.field_0._0_8_
                                          ;
                                          (pbVar81->Stream).Alloc = (allocator *)local_3618._16_8_;
                                          (pbVar81->Stream).Data = pbVar15;
                                          (pbVar81->Stream).Bytes = iVar11;
                                          pbVar81->BitPtr = pbVar60;
                                          pbVar81->BitBuf = uVar65;
                                          pbVar81->BitPos = uVar80;
                                        }
                                        local_3720 = CONCAT44(local_3720._4_4_,
                                                              CONCAT31((int3)((ulong)local_3720 >> 8
                                                                             ),(char)local_3720 +
                                                                               (char)local_3678));
                                        LOCK();
                                        local_2c60._M_i =
                                             local_2c60._M_i +
                                             ((long)pbVar81->BitPos - (long)(int)local_3780) +
                                             (long)(pbVar81->BitPtr +
                                                   ((long)pbVar62 -
                                                   (long)(local_3718 + (long)(pbVar81->Stream).Data)
                                                   )) * 8;
                                        UNLOCK();
                                        iVar25 = 0;
                                      }
                                      else {
                                        ReadChunk((
                                                  expected<const_idx2::chunk_cache_*,_idx2::idx2_err_code>
                                                  *)local_3618,local_37b8,(decode_data *)local_2ec8,
                                                  local_3750,(i8)local_3784,(i8)local_3708,
                                                  local_37a4._0_2_);
                                        if (local_3600 == false) {
                                          iVar25 = 7;
                                          pbVar81 = (bitstream *)0x0;
                                          cVar34 = '\0';
                                        }
                                        else {
                                          local_3780 = CONCAT71(local_3780._1_7_,local_3600);
                                          puVar7 = (ulong *)(((array<unsigned_long> *)
                                                             (local_3618._8_8_ + 8))->Buffer).Data;
                                          puVar42 = (ulong *)((array<unsigned_long> *)
                                                             (local_3618._8_8_ + 8))->Size;
                                          puVar58 = puVar7 + (long)puVar42;
                                          puVar64 = puVar7;
                                          do {
                                            puVar43 = puVar58;
                                            if (puVar58 <= puVar64) break;
                                            puVar59 = (ulong *)((long)puVar64 +
                                                               (((long)puVar58 - (long)puVar64 >> 3)
                                                                - ((long)puVar58 - (long)puVar64 >>
                                                                  0x3f) & 0xfffffffffffffffeU) * 4);
                                            uVar30 = *puVar59;
                                            if (uVar30 < uVar65) {
                                              puVar64 = puVar59 + 1;
                                              bVar82 = true;
                                              puVar59 = puVar58;
                                            }
                                            else {
                                              bVar82 = uVar65 < uVar30;
                                              if (uVar30 <= uVar65) {
                                                puVar42 = puVar59;
                                                puVar59 = puVar58;
                                              }
                                            }
                                            puVar43 = puVar42;
                                            puVar58 = puVar59;
                                          } while (bVar82);
                                          iVar25 = *(int *)((((array<int> *)
                                                             (local_3618._8_8_ + 0x38))->Buffer).
                                                            Data + ((long)puVar43 - (long)puVar7 >>
                                                                   1));
                                          Insert<short,idx2::bitstream>
                                                    ((iterator *)(local_3670 + 8),
                                                     (short *)local_37a4,
                                                     (bitstream *)(local_3618._8_8_ + 0x68));
                                          pbVar62 = ((local_3668.Val)->Stream).Data;
                                          (local_3668.Val)->BitPtr = pbVar62 + iVar25;
                                          (local_3668.Val)->BitBuf = *(u64 *)(pbVar62 + iVar25);
                                          (local_3668.Val)->BitPos = 0;
                                          iVar25 = 0;
                                          pbVar81 = local_3668.Val;
                                          cVar34 = (char)local_3780;
                                        }
                                        uVar30 = local_3748;
                                        if (cVar34 != '\0') goto LAB_00178c9c;
                                      }
                                      bVar82 = iVar25 != 0;
                                    }
                                    uVar80 = (uint)local_37a0;
                                    if (bVar82) break;
                                    cVar35 = cVar35 + -1;
                                    iVar24 = (int)cVar35;
                                  } while ((int)local_3778 <= iVar24);
                                }
                                bVar23 = (byte)local_36b0 | (char)local_3720 < '\x01';
                                local_36b0 = CONCAT71(local_36b0._1_7_,bVar23);
                                piVar63 = local_37b8;
                                if (bVar23 == 0) {
                                  if (7 < (int)uVar80) {
                                    TransposeRecursive<unsigned_long>
                                              ((unsigned_long *)&local_30e8,(int)(char)local_3720);
                                  }
                                  LOCK();
                                  _Stack_2c50._M_i = _Stack_2c50._M_i + 1;
                                  UNLOCK();
                                  eVar86 = (error<idx2::idx2_err_code>)
                                           (*(code *)(&DAT_001a7f38 +
                                                     *(int *)(&DAT_001a7f38 +
                                                             (local_3430 & 0xffffffff) * 4)))();
                                  return eVar86;
                                }
LAB_001795e8:
                                uVar26 = local_3724 + 1;
LAB_001795eb:
                                Val = (brick_volume *)(ulong)uVar26;
                              } while (uVar26 <= local_361c);
                              LOCK();
                              _Stack_2c48._M_i =
                                   _Stack_2c48._M_i + (ulong)(byte)((byte)local_372c ^ 1);
                              UNLOCK();
                              uVar32 = (hash_table<short,_idx2::bitstream> *)
                                       ((ulong)local_3448 & 0xffffffffffffff00 |
                                       (ulong)(local_372c & 0xff));
                              piVar55 = local_3688;
                              uVar77 = local_3450;
                              cVar35 = local_37a4[3];
                            }
                            phVar78 = (hash_table<short,_idx2::bitstream> *)uVar32;
                            piVar57 = (idx2 *)uVar77;
                            if (cVar35 != '\0') {
                              uVar46 = (undefined1)uVar32;
                              if ((local_3108.Val)->Significant != false) {
                                uVar46 = true;
                              }
                              (local_3108.Val)->Significant = (bool)uVar46;
                              phVar78 = local_3570;
                              piVar57 = local_3440;
                            }
                            this = piVar57;
                            local_3570 = phVar78;
                            local_3450 = (idx2 *)uVar77;
                            if (cVar35 == '\0') break;
                          }
                          cVar35 = (char)local_37a8 + '\x01';
                          local_37a8 = CONCAT31((int3)((uint)local_37a8 >> 8),cVar35);
                          uVar26 = (uint)cVar35;
                          bVar82 = (int)(char)(piVar63->Subbands).Size == uVar26;
                          local_3730 = (uint)CONCAT71((int7)((ulong)uVar32 >> 8),bVar82);
                          phVar78 = local_3570;
                          this = piVar57;
                        } while (!bVar82);
                      }
                      uVar26 = (uint)this;
                      if ((local_3730 & 1) != 0) {
                        Val = local_3578;
                        InverseCdf53(local_3580,local_3784,local_3470,local_3478,&local_3578->Vol,
                                     local_3764 == piVar63->NLevels);
                        *local_3588 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Decode.cpp"
                        ;
                        *local_3590 = 0x140;
                        phVar78 = (hash_table<short,_idx2::bitstream> *)0x1a94c3;
                        uVar26 = 0;
                      }
                      Dealloc<short,idx2::bitstream>(&local_33e8);
                      iVar22 = local_30e8;
                      if ((char)uVar26 == '\0') {
                        if ((bVar68 == 0) ||
                           (iVar36 = 9, (piVar63->DecodeSubbandMasks).Arr[local_3758 + -1] == '\0'))
                        {
                          Grid2 = (grid *)(((ulong)(uint)(piVar63->BrickDims3).field_0.field_0.Y &
                                           0x1fffff) << 0x15 |
                                          (ulong)(uint)(piVar63->BrickDims3).field_0.field_0.X &
                                          0x1fffff);
                          local_30e8.Val =
                               (brick_volume *)
                               ((ulong)((piVar63->BrickDims3).field_0.field_0.Z & 0x1fffff) << 0x2a
                               | (ulong)Grid2);
                          local_30e8.Key =
                               (unsigned_long *)
                               ((ulong)((int)piVar55->Idx * local_36e8 & 0x1fffff) << 0x2a |
                               (ulong)(*(int *)((long)&piVar55->Ht + 4) * (int)local_3598 & 0x1fffff
                                      ) << 0x15 |
                               (ulong)(*(int *)&piVar55->Ht * local_36ec & 0x1fffff));
                          local_30e8.Idx = iVar22.Idx;
                          local_30e8.Ht =
                               (hash_table<unsigned_long,_idx2::brick_volume> *)local_3480;
                          Crop<idx2::grid,idx2::grid>
                                    ((grid *)&local_33e8,(idx2 *)&local_33a0,(grid *)&local_30e8,
                                     Grid2);
                          ppVar54 = local_3760;
                          Relative<idx2::grid,idx2::grid>
                                    ((grid *)local_35f8,(idx2 *)&local_33e8,(grid *)&local_30e8,
                                     Grid2);
                          dVar21 = local_3158[0x20];
                          dVar47 = local_34b8;
                          oVar3 = ppVar54->OutMode;
                          if (oVar3 < HashMap) {
                            Relative<idx2::grid,idx2::grid>
                                      ((grid *)&local_3358,(idx2 *)&local_33e8,&local_33a0,Grid2);
                            if (oVar3 == RegularGridFile) {
                              dVar47 = dVar21;
                            }
                            Key_00 = &local_34d8;
                            if (oVar3 == RegularGridFile) {
                              Key_00 = (byte **)local_3158;
                            }
                            pcVar33 = CopyGridGrid<double,double>;
                            if (dVar47 == float32) {
                              pcVar33 = CopyGridGrid<double,float>;
                            }
                            (*pcVar33)(local_35f8,&local_3518,&local_3358);
                            Dealloc(&local_3518);
                            Delete<unsigned_long,idx2::brick_volume>
                                      ((iterator *)&local_3358,(idx2 *)(local_2ec8 + 0x38),
                                       (hash_table<unsigned_long,_idx2::brick_volume> *)local_3670,
                                       (unsigned_long *)Key_00);
                          }
                          else if ((oVar3 == HashMap) && ((local_2ee8.Val)->Significant == false)) {
                            Dealloc(&local_3518);
                            Delete<unsigned_long,idx2::brick_volume>
                                      ((iterator *)&local_3358,(idx2 *)(local_2ec8 + 0x38),
                                       (hash_table<unsigned_long,_idx2::brick_volume> *)local_3670,
                                       (unsigned_long *)Grid2);
                          }
                          iVar36 = 9;
                        }
                      }
                      else {
                        cVar35 = (char)(uVar26 >> 8);
                        if ('?' < cVar35) {
                          __assert_fail("false && \"stack too deep\"",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Decode.cpp"
                                        ,0x1aa,
                                        "auto idx2::Decode(const idx2_file &, const params &, buffer *)::(anonymous class)::operator()() const"
                                       );
                        }
                        cVar35 = cVar35 + '\x01';
                        local_3738 = (uint)CONCAT21((short)(uVar26 >> 0x10),cVar35);
                        local_3590[cVar35] = 0x1aa;
                        local_3588[cVar35] =
                             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Decode.cpp"
                        ;
                        local_36e4 = uVar26 >> 0x10;
                        iVar36 = 1;
                        local_36e0 = uVar26;
                        local_3468 = phVar78;
                      }
                    }
                    else {
                      phVar10 = (&local_2c38)[uVar30 * 2].Ht;
                      iVar11 = (&local_2c38)[uVar30 * 2].Idx;
                      local_3358.LogCapacity = (&uStack_2c18)[uVar30 * 8];
                      local_3358.Alloc = (allocator *)(&uStack_2c10)[uVar30 * 8];
                      uStack_3328 = auStack_2c08[uVar30 * 8];
                      uStack_3320 = auStack_2c08[uVar30 * 8 + 1];
                      local_3358.Vals = (&local_2c38)[uVar30 * 2].Val;
                      local_3358.Keys = piVar55->Key;
                      local_3358.Stats = (bucket_status *)phVar10;
                      local_3358.Size = iVar11;
                      auVar1 = (undefined1  [32])local_3358._0_32_;
                      local_30e8 = *piVar55;
                      local_30c8 = (unsigned_long *)(&uStack_2c18)[uVar30 * 8];
                      pbStack_30c0 = (brick_volume *)(&uStack_2c10)[uVar30 * 8];
                      phStack_30b8 = (hash_table<unsigned_long,_idx2::brick_volume> *)
                                     auStack_2c08[uVar30 * 8];
                      uStack_30b0 = auStack_2c08[uVar30 * 8 + 1];
                      uVar65 = (ulong)((uVar26 & 3) << 2);
                      iVar24 = *(int *)((long)&(&local_2c38)[uVar30 * 2].Ht + uVar65);
                      iVar24 = (*(int *)((long)&(&local_2c38)[uVar30 * 2].Idx + uVar65 + 4) - iVar24
                               ) / 2 + iVar24;
                      *(int *)((long)&local_3358 + uVar65 + 0x1c) = iVar24;
                      paVar20 = local_3358.Alloc;
                      *(int *)((long)&local_30e8.Ht + uVar65) = iVar24;
                      local_3358.Size._4_4_ = (int)((ulong)iVar11 >> 0x20);
                      local_3358.Stats._0_4_ = (int)phVar10;
                      local_37b0 = (ulong)phVar10 & 0xffffffff;
                      local_3358.Stats._4_4_ = (uint)((ulong)phVar10 >> 0x20);
                      local_3790 = (brick_volume *)CONCAT44(local_3790._4_4_,local_3358.Size._4_4_);
                      uVar26 = local_3358.Size._4_4_ - (int)local_3358.Stats;
                      lVar66 = (long)(int)local_3358.LogCapacity;
                      lVar39 = (long)(int)local_3358.Stats._4_4_;
                      lVar29 = (long)local_3358.LogCapacity._4_4_;
                      local_3358.Size._0_4_ = (uint)iVar11;
                      lVar52 = (long)(int)(uint)local_3358.Size;
                      local_3518.Vol.Buffer.Data =
                           (byte *)((ulong)((uint)local_3358.Size & 0x1fffff) << 0x2a |
                                   ((ulong)local_3358.Stats._4_4_ & 0x1fffff) << 0x15 |
                                   (ulong)phVar10 & 0x1fffff);
                      local_3518.Vol.Buffer.Bytes =
                           (ulong)((uint)(lVar29 - lVar52) & 0x1fffff) << 0x2a |
                           (ulong)((uint)(lVar66 - lVar39) & 0x1fffff) << 0x15 |
                           (ulong)(uVar26 & 0x1fffff);
                      local_3358._0_32_ = auVar1;
                      eVar85 = Crop<idx2::extent,idx2::extent>((extent *)Vol_00,&local_3528);
                      uVar31 = eVar85.Dims;
                      pbStack_30c0 = (brick_volume *)
                                     ((long)&paVar20->_vptr_allocator +
                                     ((long)(uVar31 << 0x16) >> 0x2b) *
                                     ((long)(uVar31 << 0x2b) >> 0x2b) * ((long)(uVar31 * 2) >> 0x2b)
                                     );
                      iVar24 = (int)uStack_3328;
                      eVar85 = Crop<idx2::extent,idx2::extent>((extent *)Vol_00,&local_3378);
                      phStack_30b8 = (hash_table<unsigned_long,_idx2::brick_volume> *)
                                     CONCAT44(phStack_30b8._4_4_,
                                              (((int)eVar85.Dims << 0xb) >> 0xb) *
                                              (int)((long)(eVar85.Dims * 2) >> 0x2b) *
                                              (int)((long)(eVar85.Dims << 0x16) >> 0x2b) + iVar24);
                      uStack_3320 = local_3688[1].Idx;
                      uStack_30b0 = (lVar66 - lVar39) * (long)(int)uVar26 * (lVar29 - lVar52) +
                                    uStack_3320;
                      uVar30 = (long)(local_3528.From << 0x16) >> 0xb;
                      lVar39 = (long)(local_3528.Dims << 0x16) >> 0xb;
                      iVar24 = (int)((long)(local_3528.Dims << 0x2b) >> 0x2b);
                      iVar25 = (int)((long)(local_3528.From << 0x2b) >> 0x2b);
                      iVar36 = (int)((long)(local_3528.From * 2) >> 0x2b);
                      iVar38 = (int)((long)(local_3528.Dims * 2) >> 0x2b) + iVar36;
                      iVar37 = (int)((long)(local_3528.From << 0x16) >> 0x2b);
                      if (((((int)local_30e8.Ht < iVar24 + iVar25) &&
                           (local_30e8.Ht._4_4_ <
                            (int)((uVar30 & 0xffffffff00000000) + lVar39 >> 0x20))) &&
                          (((int)local_30e8.Idx < iVar38 &&
                           ((iVar25 < local_30e8.Idx._4_4_ && (iVar37 < (int)local_30c8)))))) &&
                         (iVar36 < local_30c8._4_4_)) {
                        local_3688[1].Key = local_30c8;
                        local_3688[1].Val = pbStack_30c0;
                        local_3688[1].Ht = phStack_30b8;
                        local_3688[1].Idx = uStack_30b0;
                        *local_3688 = local_30e8;
                        local_3794 = uVar80;
                      }
                      uVar26 = iVar24 + iVar25;
                      Val = (brick_volume *)(ulong)uVar26;
                      if ((int)local_37b0 < (int)uVar26) {
                        Val = (brick_volume *)(uVar30 & 0xffffffff00000000);
                        if (((((int)local_3358.Stats._4_4_ <
                               (int)((ulong)((long)&(Val->Vol).Buffer.Data + lVar39) >> 0x20)) &&
                             ((int)(uint)local_3358.Size < iVar38)) && (iVar25 < (int)local_3790))
                           && ((iVar37 < (int)local_3358.LogCapacity &&
                               (iVar36 < local_3358.LogCapacity._4_4_)))) {
                          lVar39 = (long)(int)local_3794;
                          local_3794 = local_3794 + 1;
                          auStack_2bd8[lVar39 * 8] = local_3358.LogCapacity;
                          auStack_2bd8[lVar39 * 8 + 1] = (ulong)local_3358.Alloc;
                          auStack_2bd8[lVar39 * 8 + 2] = uStack_3328;
                          auStack_2bd8[lVar39 * 8 + 3] = uStack_3320;
                          piVar71 = (iterator *)((long)&iStack_2bf8 + lVar39 * 0x40);
                          piVar71->Key = local_3358.Keys;
                          piVar71->Val = local_3358.Vals;
                          piVar71->Ht = (hash_table<unsigned_long,_idx2::brick_volume> *)
                                        local_3358.Stats;
                          piVar71->Idx = local_3358.Size;
                        }
                      }
                      iVar36 = 0;
                      piVar71 = local_3688;
                      piVar63 = local_37b8;
                    }
                  }
                  if ((iVar36 != 9) && (iVar36 != 0)) goto LAB_00179d37;
                  uVar30 = (ulong)local_3794;
                } while (-1 < (int)local_3794);
                iVar36 = 0;
LAB_00179d37:
                if (iVar36 == 0) {
                  iVar36 = 7;
                }
                uVar30 = (ulong)local_376c;
                goto LAB_00179d48;
              }
              uStack_2c18._0_4_ = (int)*(undefined8 *)(local_1c38[0].Name + lVar39 + 0x20);
              uStack_2c18._4_4_ =
                   (int)((ulong)*(undefined8 *)(local_1c38[0].Name + lVar39 + 0x20) >> 0x20);
              uStack_2c10 = *(ulong *)(local_1c38[0].Field + lVar39 + -0x18);
              auStack_2c08[0] = *(ulong *)(local_1c38[0].Field + lVar39 + -0x10);
              auStack_2c08[1] = *(undefined8 *)(local_1c38[0].Field + lVar39 + -8);
              local_2c38.Key = (unsigned_long *)piVar55->Key;
              local_2c38.Val = *(brick_volume **)(local_1c38[0].Name + lVar39 + 8);
              local_2c38.Ht._0_4_ = (uint)*(undefined8 *)(local_1c38[0].Name + lVar39 + 0x10);
              local_2c38.Ht._4_4_ =
                   (uint)((ulong)*(undefined8 *)(local_1c38[0].Name + lVar39 + 0x10) >> 0x20);
              local_2c38.Idx._0_4_ = (uint)*(undefined8 *)(local_1c38[0].Name + lVar39 + 0x18);
              local_2c38.Idx._4_4_ =
                   (int)((ulong)*(undefined8 *)(local_1c38[0].Name + lVar39 + 0x18) >> 0x20);
              local_3358._0_32_ = *piVar55;
              local_3358.LogCapacity = *(i64 *)(local_1c38[0].Name + lVar39 + 0x20);
              local_3358.Alloc = *(allocator **)(local_1c38[0].Field + lVar39 + -0x18);
              uStack_3328 = *(ulong *)(local_1c38[0].Field + lVar39 + -0x10);
              uStack_3320 = *(ulong *)(local_1c38[0].Field + lVar39 + -8);
              uVar65 = (ulong)((uVar26 & 3) << 2);
              iVar24 = (*(int *)(local_1c38[0].Name + uVar65 + lVar39 + 0x1c) -
                       *(int *)(local_1c38[0].Name + uVar65 + lVar39 + 0x10)) / 2 +
                       *(int *)(local_1c38[0].Name + uVar65 + lVar39 + 0x10);
              *(int *)((long)&local_2c38.Idx + uVar65 + 4) = iVar24;
              *(int *)((long)&local_3358 + uVar65 + 0x10) = iVar24;
              uVar65 = uStack_2c10;
              local_37b0 = (ulong)(uint)local_2c38.Ht;
              local_3790 = (brick_volume *)CONCAT44(local_3790._4_4_,local_2c38.Idx._4_4_);
              uVar26 = local_2c38.Idx._4_4_ - (uint)local_2c38.Ht;
              lVar74 = (long)(int)uStack_2c18;
              lVar52 = (long)(int)local_2c38.Ht._4_4_;
              lVar66 = (long)uStack_2c18._4_4_;
              lVar29 = (long)(int)(uint)local_2c38.Idx;
              local_30e8.Val =
                   (brick_volume *)
                   ((ulong)((uint)(lVar66 - lVar29) & 0x1fffff) << 0x2a |
                   (ulong)((uint)(lVar74 - lVar52) & 0x1fffff) << 0x15 | (ulong)(uVar26 & 0x1fffff))
              ;
              local_30e8.Key =
                   (unsigned_long *)
                   ((ulong)((uint)local_2c38.Idx & 0x1fffff) << 0x2a |
                   ((ulong)local_2c38.Ht._4_4_ & 0x1fffff) << 0x15 | local_37b0 & 0x1fffff);
              local_37a0 = uVar30;
              eVar85 = Crop<idx2::extent,idx2::extent>((extent *)&local_30e8,&local_3538);
              uVar31 = eVar85.Dims;
              local_3358.Alloc =
                   (allocator *)
                   (((long)(uVar31 << 0x16) >> 0x2b) * ((long)(uVar31 << 0x2b) >> 0x2b) *
                    ((long)(uVar31 * 2) >> 0x2b) + uVar65);
              iVar24 = (int)auStack_2c08[0];
              eVar85 = Crop<idx2::extent,idx2::extent>((extent *)&local_30e8,&local_3388);
              uStack_3328 = CONCAT44(uStack_3328._4_4_,
                                     (((int)eVar85.Dims << 0xb) >> 0xb) *
                                     (int)((long)(eVar85.Dims * 2) >> 0x2b) *
                                     (int)((long)(eVar85.Dims << 0x16) >> 0x2b) + iVar24);
              auStack_2c08[1] = *(ulong *)(local_1c38[0].Field + lVar39 + -8);
              uStack_3320 = (lVar74 - lVar52) * (long)(int)uVar26 * (lVar66 - lVar29) +
                            auStack_2c08[1];
              uVar30 = (long)(local_3538.From << 0x16) >> 0xb;
              lVar52 = (long)(local_3538.Dims << 0x16) >> 0xb;
              iVar24 = (int)((long)(local_3538.Dims << 0x2b) >> 0x2b);
              iVar25 = (int)((long)(local_3538.From << 0x2b) >> 0x2b);
              iVar36 = (int)((long)(local_3538.From * 2) >> 0x2b);
              iVar38 = (int)((long)(local_3538.Dims * 2) >> 0x2b) + iVar36;
              iVar37 = (int)((long)(local_3538.From << 0x16) >> 0x2b);
              if (((((int)local_3358.Stats < iVar24 + iVar25) &&
                   ((int)local_3358.Stats._4_4_ <
                    (int)((uVar30 & 0xffffffff00000000) + lVar52 >> 0x20))) &&
                  ((int)(uint)local_3358.Size < iVar38)) &&
                 (((iVar25 < local_3358.Size._4_4_ && (iVar37 < (int)local_3358.LogCapacity)) &&
                  (iVar36 < local_3358.LogCapacity._4_4_)))) {
                *(i64 *)(local_1c38[0].Name + lVar39 + 0x20) = local_3358.LogCapacity;
                *(allocator **)(local_1c38[0].Field + lVar39 + -0x18) = local_3358.Alloc;
                *(ulong *)(local_1c38[0].Field + lVar39 + -0x10) = uStack_3328;
                *(ulong *)(local_1c38[0].Field + lVar39 + -8) = uStack_3320;
                piVar55->Key = local_3358.Keys;
                piVar55->Val = local_3358.Vals;
                piVar55->Ht = (hash_table<unsigned_long,_idx2::brick_volume> *)local_3358.Stats;
                piVar55->Idx = local_3358.Size;
                local_376c = (uint)local_37a0;
              }
              uVar72 = (undefined7)((ulong)piVar71 >> 8);
              uVar26 = local_376c;
              if ((((int)local_37b0 < iVar24 + iVar25) &&
                  ((int)local_2c38.Ht._4_4_ < (int)(lVar52 + (uVar30 & 0xffffffff00000000) >> 0x20))
                  ) && (((int)(uint)local_2c38.Idx < iVar38 &&
                        (((iVar25 < (int)local_3790 && (iVar37 < (int)uStack_2c18)) &&
                         (iVar36 < uStack_2c18._4_4_)))))) {
                lVar39 = (long)(int)local_376c * 0x40;
                auVar13._8_8_ = local_2c38.Val;
                auVar13._0_8_ = local_2c38.Key;
                auVar13._16_4_ = (uint)local_2c38.Ht;
                auVar13._20_4_ = local_2c38.Ht._4_4_;
                auVar13._24_4_ = (uint)local_2c38.Idx;
                auVar13._28_4_ = local_2c38.Idx._4_4_;
                *(ulong *)(local_1c38[0].Field + lVar39 + 0x20) =
                     CONCAT44(uStack_2c18._4_4_,(int)uStack_2c18);
                *(ulong *)(local_1c38[0].Field + lVar39 + 0x28) = uStack_2c10;
                *(ulong *)(local_1c38[0].Field + lVar39 + 0x30) = auStack_2c08[0];
                *(ulong *)(local_1c38[0].Field + lVar39 + 0x38) = auStack_2c08[1];
                *(undefined1 (*) [32])(local_1c38[0].Field + lVar39) = auVar13;
                uVar26 = local_376c + 1;
              }
              iVar36 = 0;
              uVar30 = (ulong)uVar26;
              piVar63 = local_37b8;
            }
            piVar71 = (iterator *)CONCAT71(uVar72,bVar68);
            if ((iVar36 != 7) && (iVar36 != 0)) goto LAB_00179d61;
          } while (-1 < (int)uVar30);
          iVar36 = 0;
LAB_00179d61:
          if (iVar36 == 0) {
            iVar36 = 5;
          }
          uVar30 = (ulong)local_37bc;
          ppVar54 = local_3760;
        }
        else {
          uVar32 = *(undefined8 *)(aiStack_c28 + uVar30 * 0xc);
          local_1c38[0].Name._32_4_ = (undefined4)*(undefined8 *)(aiStack_c18 + uVar30 * 0xc);
          local_1c38[0].Name._36_4_ =
               (undefined4)((ulong)*(undefined8 *)(aiStack_c18 + uVar30 * 0xc) >> 0x20);
          local_1c38[0].Name._40_8_ = auStack_c10[uVar30 * 6];
          local_1c38[0].Name._0_8_ = *(unsigned_long *)*pauVar40;
          local_1c38[0].Name._8_8_ = local_c38[uVar30 * 6 + 1];
          local_1c38[0].Name._16_4_ = (undefined4)uVar32;
          local_1c38[0].Name._20_4_ = (undefined4)((ulong)uVar32 >> 0x20);
          local_1c38[0].Name._24_4_ = (undefined4)*(undefined8 *)(auStack_c20 + lVar39);
          local_1c38[0].Name._28_4_ =
               (undefined4)((ulong)*(undefined8 *)(auStack_c20 + lVar39) >> 0x20);
          auVar1 = *pauVar40;
          uStack_2c18._0_4_ = (int)*(undefined8 *)(aiStack_c18 + uVar30 * 0xc);
          uStack_2c18._4_4_ = (int)((ulong)*(undefined8 *)(aiStack_c18 + uVar30 * 0xc) >> 0x20);
          uStack_2c10 = auStack_c10[uVar30 * 6];
          local_2c38.Key = auVar1._0_8_;
          local_2c38.Val = auVar1._8_8_;
          local_2c38.Ht._0_4_ = auVar1._16_4_;
          local_2c38.Ht._4_4_ = auVar1._20_4_;
          local_2c38.Idx._0_4_ = auVar1._24_4_;
          local_2c38.Idx._4_4_ = auVar1._28_4_;
          uVar65 = (ulong)((uVar26 & 3) << 2);
          iVar24 = *(int *)((long)aiStack_c28 + uVar65 + lVar39);
          iVar24 = (*(int *)(auStack_c20 + uVar65 + lVar39 + 4) - iVar24) / 2 + iVar24;
          *(int *)(local_1c38[0].Name + uVar65 + 0x1c) = iVar24;
          *(int *)((long)&local_2c38.Ht + uVar65) = iVar24;
          lVar52 = auStack_c10[uVar30 * 6];
          local_1c38[0].Name[0x28] = (char)lVar52;
          local_1c38[0].Name[0x29] = (char)((ulong)lVar52 >> 8);
          local_1c38[0].Name[0x2a] = (char)((ulong)lVar52 >> 0x10);
          local_1c38[0].Name[0x2b] = (char)((ulong)lVar52 >> 0x18);
          local_1c38[0].Name[0x2c] = (char)((ulong)lVar52 >> 0x20);
          local_1c38[0].Name[0x2d] = (char)((ulong)lVar52 >> 0x28);
          local_1c38[0].Name[0x2e] = (char)((ulong)lVar52 >> 0x30);
          local_1c38[0].Name[0x2f] = (char)((ulong)lVar52 >> 0x38);
          uStack_2c10 = (long)(int)(local_1c38[0].Name._28_4_ - local_1c38[0].Name._16_4_) *
                        ((long)(int)local_1c38[0].Name._36_4_ - (long)(int)local_1c38[0].Name._24_4_
                        ) * ((long)(int)local_1c38[0].Name._32_4_ -
                            (long)(int)local_1c38[0].Name._20_4_) + lVar52;
          if (((((int)(uint)local_2c38.Ht < (int)local_35a0) &&
               ((int)local_2c38.Ht._4_4_ < (int)local_35a8)) &&
              (((int)(uint)local_2c38.Idx < (int)local_35b0 &&
               (((int)local_35b8 < local_2c38.Idx._4_4_ && ((int)local_35c0 < (int)uStack_2c18))))))
             && ((int)local_36d0 < uStack_2c18._4_4_)) {
            auVar12._16_4_ = (uint)local_2c38.Ht;
            auVar12._0_16_ = auVar1._0_16_;
            auVar12._20_4_ = local_2c38.Ht._4_4_;
            auVar12._24_4_ = (uint)local_2c38.Idx;
            auVar12._28_4_ = local_2c38.Idx._4_4_;
            *(ulong *)(aiStack_c28 + uVar30 * 0xc) =
                 CONCAT44(local_2c38.Ht._4_4_,(uint)local_2c38.Ht);
            *(ulong *)(auStack_c20 + lVar39) = CONCAT44(local_2c38.Idx._4_4_,(uint)local_2c38.Idx);
            *(ulong *)(aiStack_c18 + uVar30 * 0xc) = CONCAT44(uStack_2c18._4_4_,(int)uStack_2c18);
            auStack_c10[uVar30 * 6] = uStack_2c10;
            *pauVar40 = auVar12;
            local_37bc = (uint)uVar30;
          }
          uVar26 = local_37bc;
          if ((((((int)local_1c38[0].Name._16_4_ < (int)local_35a0) &&
                ((int)local_1c38[0].Name._20_4_ < (int)local_35a8)) &&
               ((int)local_1c38[0].Name._24_4_ < (int)local_35b0)) &&
              (((int)local_35b8 < (int)local_1c38[0].Name._28_4_ &&
               ((int)local_35c0 < (int)local_1c38[0].Name._32_4_)))) &&
             ((int)local_36d0 < (int)local_1c38[0].Name._36_4_)) {
            lVar39 = (long)(int)(local_37bc + 1);
            auVar1[8] = local_1c38[0].Name[8];
            auVar1[9] = local_1c38[0].Name[9];
            auVar1[10] = local_1c38[0].Name[10];
            auVar1[0xb] = local_1c38[0].Name[0xb];
            auVar1[0xc] = local_1c38[0].Name[0xc];
            auVar1[0xd] = local_1c38[0].Name[0xd];
            auVar1[0xe] = local_1c38[0].Name[0xe];
            auVar1[0xf] = local_1c38[0].Name[0xf];
            auVar1[0] = local_1c38[0].Name[0];
            auVar1[1] = local_1c38[0].Name[1];
            auVar1[2] = local_1c38[0].Name[2];
            auVar1[3] = local_1c38[0].Name[3];
            auVar1[4] = local_1c38[0].Name[4];
            auVar1[5] = local_1c38[0].Name[5];
            auVar1[6] = local_1c38[0].Name[6];
            auVar1[7] = local_1c38[0].Name[7];
            auVar1[0x10] = local_1c38[0].Name[0x10];
            auVar1[0x11] = local_1c38[0].Name[0x11];
            auVar1[0x12] = local_1c38[0].Name[0x12];
            auVar1[0x13] = local_1c38[0].Name[0x13];
            auVar1[0x14] = local_1c38[0].Name[0x14];
            auVar1[0x15] = local_1c38[0].Name[0x15];
            auVar1[0x16] = local_1c38[0].Name[0x16];
            auVar1[0x17] = local_1c38[0].Name[0x17];
            auVar1[0x18] = local_1c38[0].Name[0x18];
            auVar1[0x19] = local_1c38[0].Name[0x19];
            auVar1[0x1a] = local_1c38[0].Name[0x1a];
            auVar1[0x1b] = local_1c38[0].Name[0x1b];
            auVar1[0x1c] = local_1c38[0].Name[0x1c];
            auVar1[0x1d] = local_1c38[0].Name[0x1d];
            auVar1[0x1e] = local_1c38[0].Name[0x1e];
            auVar1[0x1f] = local_1c38[0].Name[0x1f];
            *(undefined8 *)(aiStack_c28 + lVar39 * 0xc) = uVar32;
            *(ulong *)(auStack_c20 + lVar39 * 0x30) =
                 CONCAT44(local_1c38[0].Name._28_4_,local_1c38[0].Name._24_4_);
            *(ulong *)(aiStack_c18 + lVar39 * 0xc) =
                 CONCAT44(local_1c38[0].Name._36_4_,local_1c38[0].Name._32_4_);
            auStack_c10[lVar39 * 6] = lVar52;
            *(undefined1 (*) [32])(local_c38 + lVar39 * 6) = auVar1;
            uVar26 = local_37bc + 1;
          }
          uVar30 = (ulong)uVar26;
          iVar36 = 0;
        }
      }
      if ((iVar36 != 5) && (iVar36 != 0)) goto LAB_00179d87;
    } while (-1 < (int)uVar30);
    iVar36 = 0;
LAB_00179d87:
    iVar24 = local_3640 + -1;
    local_3690 = (ulong)piVar71 & 0xffffffff;
    pbVar62 = local_36a8;
    lVar39 = local_3498;
    uVar30 = local_3490;
  } while (iVar36 == 0);
  phVar78 = local_3468;
  uVar26 = local_36e0;
  uVar80 = local_36e4;
  if (iVar36 == 2) {
    if (ppVar54->OutMode == HashMap) {
      Bp = (brick_pool *)(local_2ec8 + 0x38);
      PrintStatistics(Bp);
      ComputeBrickResolution(Bp);
      WriteBricks(Bp,"bricks");
    }
    clock_gettime(1,(timespec *)local_1c38);
    printf("total decode time   = %f\n",
           (double)(long)((double)(local_1c38[0].Name._0_8_ - local_3368.tv_sec) * 1000000000.0 +
                         (double)(local_1c38[0].Name._8_8_ - local_3368.tv_nsec)) / 1000000000.0,
           (double)(local_1c38[0].Name._8_8_ - local_3368.tv_nsec),0x41cdcd6500000000,0);
    printf("io time             = %f\n",(double)(long)_Stack_2c78._M_i / 1000000000.0);
    printf("data movement time  = %f\n",
           (double)(long)aStack_2c58.super___atomic_base<unsigned_long>._M_i / 1000000000.0);
    uVar26 = 0;
    printf("exp   bytes read    = %li\n",_Stack_2c70._M_i);
    printf("data  bytes read    = %li\n",_Stack_2c68._M_i);
    printf("total bytes read    = %li\n",_Stack_2c68._M_i + _Stack_2c70._M_i);
    printf("total bytes decoded = %li\n",local_2c60._M_i >> 3);
    printf("final size of brick hashmap = %li\n",bStack_2e90.BrickTable.Size);
    printf("number of significant blocks = %li\n",_Stack_2c50._M_i);
    printf("number of insignificant subbands = %li\n",_Stack_2c48._M_i);
    *(char **)(*in_FS_OFFSET + -0x780) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Decode.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x880) = 0x1eb;
    phVar78 = (hash_table<short,_idx2::bitstream> *)0x1a94c3;
    local_3738 = 0;
    uVar80 = 0;
  }
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Decode.cpp:362:3)>
  ::~scope_guard(&local_33f8);
  std::condition_variable::~condition_variable((condition_variable *)(local_2ec8 + 0x218));
  BS::thread_pool::~thread_pool((thread_pool *)(local_2ec8 + 0xa0));
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Decode.cpp:334:3)>
  ::~scope_guard(&local_33b8);
  uVar26 = uVar26 & 0xff | (local_3738 & 0xff) << 8 | (uVar80 & 0xff) << 0x10;
  eVar86.Code = (char)uVar26;
  eVar86.StackIdx = (char)(uVar26 >> 8);
  eVar86.StrGened = (bool)(char)(uVar26 >> 0x10);
  eVar86._11_1_ = (char)(uVar26 >> 0x18);
  eVar86.Msg = (cstr)phVar78;
  eVar86._12_4_ = 0;
  return eVar86;
}

Assistant:

error<idx2_err_code>
Decode(const idx2_file& Idx2, const params& P, buffer* OutBuf)
{
  timer DecodeTimer;
  StartTimer(&DecodeTimer);
  // TODO: we should add a --effective-mask
  grid OutGrid = GetGrid(Idx2, P.DecodeExtent);
  mmap_volume OutVol;
  volume OutVolMem;
  idx2_CleanUp(if (P.OutMode == params::out_mode::RegularGridFile) { Unmap(&OutVol); });

  if (P.OutMode == params::out_mode::RegularGridFile)
  {
    metadata Met;
    memcpy(Met.Name, Idx2.Name, sizeof(Met.Name));
    memcpy(Met.Field, Idx2.Field, sizeof(Met.Field));
    Met.Dims3 = Dims(OutGrid);
    Met.DType = Idx2.DType;
    //  printf("zfp decode time = %f\n", DecodeTime_);
    cstr OutFile = P.OutFile ? idx2_PrintScratch("%s/%s", P.OutDir, P.OutFile)
                             : idx2_PrintScratch("%s/%s-tolerance-%f.raw", P.OutDir, ToRawFileName(Met), P.DecodeTolerance);
    //    idx2_RAII(mmap_volume, OutVol, (void)OutVol, Unmap(&OutVol));
    MapVolume(OutFile, Met.Dims3, Met.DType, &OutVol, map_mode::Write);
    printf("writing output volume to %s\n", OutFile);
  }
  else if (P.OutMode == params::out_mode::RegularGridMem)
  {
    OutVolMem.Buffer = *OutBuf;
    SetDims(&OutVolMem, Dims(OutGrid));
    OutVolMem.Type = Idx2.DType;
  }

  const int BrickBytes = Prod(Idx2.BrickDimsExt3) * sizeof(f64);
  // TODO: make the free list allocator threadsafe
  //BrickAlloc_ = free_list_allocator(BrickBytes);
  // TODO: move the decode_data into idx2_file itself
  //idx2_RAII(decode_data, D, Init(&D, &BrickAlloc_));
  idx2_RAII(decode_data, D, Init(&D, &Idx2, &Mallocator())); // for now the allocator seems not a bottleneck
  //  D.QualityLevel = Dw->GetQuality();
  f64 Tolerance = Max(Idx2.Tolerance, P.DecodeTolerance);
  //  i64 CountZeroes = 0;

  decode_state Ds;
  idx2_InclusiveForBackward (i8, Level, Idx2.NLevels - 1, 0)
  {
    if (Idx2.DecodeSubbandMasks[Level] == 0)
      break;

    extent Ext = P.DecodeExtent;                  // this is in unit of samples
    v3i B3, Bf3, Bl3, C3, Cf3, Cl3, F3, Ff3, Fl3; // Brick dimensions, brick first, brick last
    B3 = Idx2.BrickDims3 * Pow(Idx2.GroupBrick3, Level);
    C3 = Idx2.BricksPerChunk3s[Level] * B3;
    F3 = C3 * Idx2.ChunksPerFile3s[Level];

    Bf3 = From(Ext) / B3;
    Bl3 = Last(Ext) / B3;
    Cf3 = From(Ext) / C3;
    Cl3 = Last(Ext) / C3;
    Ff3 = From(Ext) / F3;
    Fl3 = Last(Ext) / F3;

    extent ExtentInBricks(Bf3, Bl3 - Bf3 + 1);
    extent ExtentInChunks(Cf3, Cl3 - Cf3 + 1);
    extent ExtentInFiles(Ff3, Fl3 - Ff3 + 1);

    extent VolExt(Idx2.Dims3);
    v3i Vbf3, Vbl3, Vcf3, Vcl3, Vff3, Vfl3; // VolBrickFirst, VolBrickLast
    Vbf3 = From(VolExt) / B3;
    Vbl3 = Last(VolExt) / B3;
    Vcf3 = From(VolExt) / C3;
    Vcl3 = Last(VolExt) / C3;
    Vff3 = From(VolExt) / F3;
    Vfl3 = Last(VolExt) / F3;

    extent VolExtentInBricks(Vbf3, Vbl3 - Vbf3 + 1);
    extent VolExtentInChunks(Vcf3, Vcl3 - Vcf3 + 1);
    extent VolExtentInFiles(Vff3, Vfl3 - Vff3 + 1);

    idx2_FileTraverse(
      //      u64 FileAddr = FileTop.Address;
      //      idx2_Assert(FileAddr == GetLinearFile(Idx2, Level, FileTop.FileFrom3));
      idx2_ChunkTraverse(
        //        u64 ChunkAddr = (FileAddr * Idx2.ChunksPerFiles[Level]) + ChunkTop.Address;
        //        idx2_Assert(ChunkAddr == GetLinearChunk(Idx2, Level, ChunkTop.ChunkFrom3));
        //D.ChunkInFile = ChunkTop.ChunkInFile;
        idx2_BrickTraverse(
          Ds.BrickInChunk = Top.BrickInChunk;
          //          u64 BrickAddr = (ChunkAddr * Idx2.BricksPerChunks[Level]) + Top.Address;
          //          idx2_Assert(BrickAddr == GetLinearBrick(Idx2, Level, Top.BrickFrom3));
          brick_volume BVol;
          Resize(&BVol.Vol, Idx2.BrickDimsExt3, dtype::float64, D.Alloc);
          // TODO: for progressive decompression, copy the data from BrickTable to BrickVol
          Fill(idx2_Range(f64, BVol.Vol), 0.0); // TODO: use memset
          Ds.Level = Level;
          Ds.Brick3 = Top.BrickFrom3;
          Ds.Brick = GetLinearBrick(Idx2, Level, Top.BrickFrom3);
          //printf("level = %d brick = %llu\n", Level, D.Brick[Level]);
          u64 BrickKey = GetBrickKey(Level, Ds.Brick);
          auto BrickIt = Insert(&D.BrickPool.BrickTable, BrickKey, BVol);
          // TODO: pass the brick iterator into the DecodeBrick function to avoid one extra lookup
          /* --------------- Decode the brick --------------- */
          idx2_PropagateIfError(DecodeBrick(Idx2, P, &D, Ds, Tolerance));
          // Copy the samples out to the output buffer (or file)
          // The Idx2.DecodeSubbandMasks[Level - 1] == 0 means that no subbands on the next level
          // will be decoded, so we can now just copy the result out
          /* -------------------- Copy wavelet inverse transform samples to the output --------------- */
          if (Level == 0 || Idx2.DecodeSubbandMasks[Level - 1] == 0)
          {// TODO: the 1 << level is only true for 1 transform pass per level
            grid BrickGrid(Top.BrickFrom3 * B3, Idx2.BrickDims3, v3i(1 << Level));
            grid OutBrickGrid = Crop(OutGrid, BrickGrid);
            grid BrickGridLocal = Relative(OutBrickGrid, BrickGrid);
            if (P.OutMode == params::out_mode::RegularGridFile ||
                P.OutMode == params::out_mode::RegularGridMem)
            {
              auto OutputVol = P.OutMode == params::out_mode::RegularGridFile ? &OutVol.Vol : &OutVolMem;
              auto CopyFunc = OutputVol->Type == dtype::float32 ? (CopyGridGrid<f64, f32>)
                                                                : (CopyGridGrid<f64, f64>);
              CopyFunc(BrickGridLocal, BVol.Vol, Relative(OutBrickGrid, OutGrid), OutputVol);
              Dealloc(&BVol);
              Delete(&D.BrickPool.BrickTable, BrickKey);
            }
            else if (P.OutMode == params::out_mode::HashMap)
            {
              //printf("deleting\n");
              if (!BrickIt.Val->Significant)
              {
                Dealloc(&BVol);
                // TODO: can we delete straight from the iterator?
                Delete(&D.BrickPool.BrickTable, BrickKey);
              }
            }
          },
          64,
          Idx2.BricksOrderInChunk[Level],
          ChunkTop.ChunkFrom3 * Idx2.BricksPerChunk3s[Level],
          Idx2.BricksPerChunk3s[Level],
          ExtentInBricks,
          VolExtentInBricks);
        ,
        64,
        Idx2.ChunksOrderInFile[Level],
        FileTop.FileFrom3 * Idx2.ChunksPerFile3s[Level],
        Idx2.ChunksPerFile3s[Level],
        ExtentInChunks,
        VolExtentInChunks);
      , 64, Idx2.FilesOrder[Level], v3i(0), Idx2.NFiles3[Level], ExtentInFiles, VolExtentInFiles);
  } // end level loop

  if (P.OutMode == params::out_mode::HashMap)
  {
    PrintStatistics(&D.BrickPool);
    ComputeBrickResolution(&D.BrickPool);
    WriteBricks(&D.BrickPool, "bricks");
  }

  printf("total decode time   = %f\n", Seconds(ElapsedTime(&DecodeTimer)));
  printf("io time             = %f\n", Seconds(D.DecodeIOTime_.load()));
  printf("data movement time  = %f\n", Seconds(D.DataMovementTime_.load()));
  printf("exp   bytes read    = %" PRIi64 "\n", D.BytesExps_.load());
  printf("data  bytes read    = %" PRIi64 "\n", D.BytesData_.load());
  printf("total bytes read    = %" PRIi64 "\n", D.BytesExps_.load() + D.BytesData_.load());
  printf("total bytes decoded = %" PRIi64 "\n", D.BytesDecoded_.load() / 8);
  printf("final size of brick hashmap = %" PRIi64 "\n", Size(D.BrickPool.BrickTable));
  printf("number of significant blocks = %" PRIi64 "\n", D.NSignificantBlocks.load());
  printf("number of insignificant subbands = %" PRIi64 "\n", D.NInsignificantSubbands.load());

  return idx2_Error(err_code::NoError);
}